

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int server_handle_hello(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,
                       ptls_handshake_properties_t *properties)

{
  undefined8 *puVar1;
  st_ptls_esni_secret_t **esni;
  ushort *end;
  uint8_t *puVar2;
  uint8_t uVar3;
  uint16_t uVar4;
  en_ptls_state_t eVar5;
  uint32_t uVar6;
  st_ptls_on_extension_t *psVar7;
  st_ptls_hash_context_t *psVar8;
  char *__s;
  st_ptls_get_time_t *psVar9;
  char *pcVar10;
  ptls_esni_context_t *ppVar11;
  st_ptls_encrypt_ticket_t *psVar12;
  ptls_key_exchange_algorithm_t *ppVar13;
  ptls_key_exchange_algorithm_t *negotiated_group;
  st_ptls_update_esni_key_t *psVar14;
  st_ptls_esni_secret_t *psVar15;
  st_ptls_update_traffic_key_t *psVar16;
  size_t sVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  char cVar21;
  ptls_iovec_t pVar22;
  ptls_iovec_t ikm;
  ptls_iovec_t pubkey_00;
  ptls_iovec_t tbs;
  char cVar23;
  ptls_cipher_suite_t *cipher;
  ushort uVar24;
  ushort uVar25;
  short sVar26;
  short sVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  ushort *puVar32;
  ushort *puVar33;
  st_ptls_hash_context_t *psVar34;
  ptls_context_t *ppVar35;
  size_t sVar36;
  ptls_key_schedule_t *ppVar37;
  uint64_t uVar38;
  ptls_key_exchange_algorithm_t **pppVar39;
  ushort *puVar40;
  uint8_t *puVar41;
  ulong uVar42;
  st_ptls_extension_bitmap_t sVar43;
  ulong uVar44;
  ushort *puVar45;
  ulong uVar46;
  long lVar47;
  size_t sVar48;
  uint8_t *puVar49;
  ushort *puVar50;
  size_t *psVar51;
  long lVar52;
  ushort *puVar53;
  anon_struct_176_2_4ca0e81c_for_traffic_protection *secret;
  uint8_t end_00 [8];
  ulong uVar54;
  ptls_cipher_suite_t **pppVar55;
  byte *pbVar56;
  long lVar57;
  ptls_buffer_t *ppVar58;
  uint16_t *puVar59;
  uint8_t *puVar60;
  size_t sVar61;
  byte *pbVar62;
  ptls_buffer_t *_buf;
  ptls_buffer_t *ppVar63;
  size_t sVar64;
  ptls_message_emitter_t *_emitter;
  size_t sVar65;
  bool bVar66;
  bool bVar67;
  ptls_iovec_t pVar68;
  ptls_iovec_t tbs_00;
  ptls_iovec_t pVar69;
  ptls_iovec_t pVar70;
  ptls_iovec_t pVar71;
  ptls_iovec_t ikm_00;
  ptls_iovec_t x;
  ptls_iovec_t x_00;
  ulong local_800;
  uint8_t *local_7f8;
  size_t local_7f0;
  size_t local_7e8;
  ptls_esni_context_t **local_7e0;
  ptls_aead_context_t *local_7d8;
  long local_7d0;
  size_t local_7c8;
  uint8_t *local_7c0;
  size_t local_7b8;
  uint16_t ticket_key_exchange_id;
  uint16_t ticket_csid;
  undefined1 local_7a8;
  undefined1 local_7a7;
  undefined1 local_7a6;
  undefined1 local_7a5;
  undefined1 local_7a4;
  undefined1 local_7a3;
  undefined1 local_7a2;
  undefined1 local_7a1;
  undefined1 local_7a0;
  undefined1 local_79f;
  undefined1 local_79e;
  undefined1 local_79d;
  uint32_t age_add;
  ptls_buffer_t session_id;
  undefined2 local_74a;
  undefined2 local_748;
  undefined2 local_746;
  undefined2 local_744;
  undefined2 local_742;
  ushort local_740;
  ushort local_73e;
  ushort local_73c;
  undefined2 local_73a;
  ushort local_738;
  ushort local_736;
  ushort local_734;
  undefined2 local_732;
  ushort local_730;
  ushort local_72e;
  ushort local_72c;
  undefined2 local_72a;
  ushort local_728;
  ushort local_726;
  ushort local_724;
  ushort local_722;
  undefined2 local_720;
  ushort local_71e;
  ushort local_71c;
  ushort local_71a;
  undefined2 local_718;
  undefined2 local_716;
  ushort local_714;
  ushort local_712;
  ushort local_710;
  undefined2 local_70e;
  ushort local_70c;
  ushort local_70a;
  anon_struct_24_2_cc7b932a key_share;
  uint64_t issue_at;
  ptls_iovec_t ticket_server_name;
  ptls_iovec_t ecdh_secret;
  ptls_iovec_t pubkey;
  ptls_iovec_t ticket_negotiated_protocol;
  uint32_t ticket_age_add;
  undefined4 uStack_6a4;
  size_t local_6a0;
  ptls_hash_algorithm_t *local_698;
  st_ptls_esni_secret_t *local_690;
  ptls_buffer_t decbuf;
  st_ptls_extension_bitmap_t bitmap;
  st_ptls_client_hello_t ch;
  uint8_t finished_key [64];
  
  uVar42 = message.len;
  puVar41 = message.base;
  memset(&ch,0,0x4e8);
  ch.unknown_extensions[0].type = 0xffff;
  key_share.algorithm = (ptls_key_exchange_algorithm_t *)0x0;
  key_share.peer_key.base = (uint8_t *)0x0;
  key_share.peer_key.len = 0;
  pubkey.base = (uint8_t *)0x0;
  pubkey.len = 0;
  ecdh_secret.base = (uint8_t *)0x0;
  ecdh_secret.len = 0;
  if ((tls->field_0x160 & 0x20) != 0) {
    ch.psk.ke_modes = tls->handshake_ke_modes;
    goto LAB_00119289;
  }
  iVar29 = 0x32;
  if ((long)uVar42 < 6) goto LAB_00119b7e;
  if ((ushort)(*(ushort *)(puVar41 + 4) << 8 | *(ushort *)(puVar41 + 4) >> 8) != 0x303)
  goto LAB_00119b7b;
  puVar40 = (ushort *)(puVar41 + uVar42);
  if (uVar42 < 0x26) goto LAB_00119b7e;
  eVar5 = tls->state;
  ch.random_bytes = puVar41 + 6;
  if ((uVar42 == 0x26) || (uVar46 = (ulong)puVar41[0x26], uVar42 - 0x27 < uVar46 || 0x20 < uVar46))
  goto LAB_00119b7e;
  ch.legacy_session_id.base = puVar41 + 0x27;
  ch.legacy_session_id.len = uVar46;
  if ((ulong)((long)puVar40 - (long)(puVar41 + uVar46 + 0x27)) < 2) goto LAB_00119b7e;
  uVar24 = *(ushort *)(puVar41 + uVar46 + 0x27);
  uVar44 = (ulong)(ushort)(uVar24 << 8 | uVar24 >> 8);
  puVar49 = puVar41 + uVar46 + 0x29;
  if ((ulong)((long)puVar40 - (long)puVar49) < uVar44) goto LAB_00119b7e;
  sVar61 = 1;
  ch.cipher_suites.base = puVar49;
  puVar50 = (ushort *)(puVar49 + uVar44);
  ch.cipher_suites.len = uVar44;
  uVar54 = 0x200;
  do {
    if ((long)uVar44 < 2) goto LAB_00119b7e;
    lVar47 = uVar54 + uVar46;
    *(ushort *)((long)ch.signature_algorithms.list + (uVar54 - 0x60)) =
         *(ushort *)(puVar41 + lVar47 + -0x1d7) << 8 | *(ushort *)(puVar41 + lVar47 + -0x1d7) >> 8;
    ch.client_ciphers.count = sVar61;
    if (0x23d < uVar54) break;
    uVar54 = uVar54 + 2;
    sVar61 = sVar61 + 1;
    uVar44 = uVar44 - 2;
  } while ((ushort *)(puVar41 + lVar47 + -0x1d5) != puVar50);
  if (puVar50 == puVar40) goto LAB_00119b7e;
  pbVar62 = (byte *)((long)puVar50 + 1);
  uVar46 = (ulong)(byte)*puVar50;
  if ((ulong)((long)puVar40 - (long)pbVar62) < uVar46 || uVar46 == 0) goto LAB_00119b7e;
  pbVar56 = (byte *)((long)puVar50 + uVar46 + 1);
  ch.compression_methods.ids = pbVar62;
  ch.compression_methods.count = (long)pbVar56 - (long)pbVar62;
  bitmap.bits[0] = '\0';
  bitmap.bits[1] = '\0';
  bitmap.bits[2] = '\0';
  bitmap.bits[3] = '\0';
  bitmap.bits[4] = '\0';
  bitmap.bits[5] = '\0';
  bitmap.bits[6] = '\0';
  bitmap.bits[7] = '\0';
  if ((ulong)((long)puVar40 - (long)pbVar56) < 2) goto LAB_00119b7e;
  uVar24 = *(ushort *)((long)puVar50 + uVar46 + 1);
  uVar44 = (ulong)(ushort)(uVar24 << 8 | uVar24 >> 8);
  puVar50 = (ushort *)((long)puVar50 + uVar46 + 3);
  if ((ulong)((long)puVar40 - (long)puVar50) < uVar44) goto LAB_00119b7e;
  puVar45 = (ushort *)(uVar44 + (long)puVar50);
  uVar24 = 0;
  iVar30 = 0x32;
  local_7b8 = 8;
  end = (ushort *)session_id.base;
LAB_00118904:
  session_id.base = (uint8_t *)end;
  if (puVar50 == puVar45) {
    if (puVar45 == puVar40) {
      iVar29 = is_supported_version(ch.selected_version);
      cipher = ch.esni.cipher;
      puVar49 = ch.random_bytes;
      if (iVar29 == 0) {
        iVar29 = 0x46;
        goto LAB_00119b7e;
      }
      iVar29 = 0x2f;
      if (((ch.compression_methods.count != 1) || (*ch.compression_methods.ids != '\0')) ||
         ((ch.esni.cipher != (ptls_cipher_suite_t *)0x0 && (ch.key_shares.base == (uint8_t *)0x0))))
      goto LAB_00119b7e;
      if (ch.psk.hash_end == (uint8_t *)0x0) {
        if (ch.psk.early_data_indication != 0) goto LAB_00119b7e;
      }
      else if (uVar24 != 0x29) goto LAB_00119b7e;
      ppVar35 = tls->ctx;
      if ((ppVar35->field_0x68 & 1) != 0) {
        ch.psk.ke_modes = ch.psk.ke_modes & 0xfffffffe;
      }
      if (eVar5 != PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
        uVar18 = *(undefined8 *)ch.random_bytes;
        uVar19 = *(undefined8 *)(ch.random_bytes + 8);
        uVar20 = *(undefined8 *)(ch.random_bytes + 0x18);
        *(undefined8 *)(tls->client_random + 0x10) = *(undefined8 *)(ch.random_bytes + 0x10);
        *(undefined8 *)(tls->client_random + 0x18) = uVar20;
        *(undefined8 *)tls->client_random = uVar18;
        *(undefined8 *)(tls->client_random + 8) = uVar19;
        if ((ch.esni.cipher == (ptls_cipher_suite_t *)0x0) ||
           (ppVar35->esni == (ptls_esni_context_t **)0x0)) {
          bVar67 = true;
          local_7f8 = ch.server_name.base;
          if (ch.server_name.base == (uint8_t *)0x0) {
            local_7f8 = (uint8_t *)0x0;
            local_7e8 = 0;
          }
          else {
            local_7e8 = ch.server_name.len;
          }
          goto LAB_00119a8f;
        }
        session_id.base = (uint8_t *)0x0;
        if (tls->esni != (st_ptls_esni_secret_t *)0x0) {
          __assert_fail("*secret == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                        ,0xba0,
                        "int client_hello_decrypt_esni(ptls_context_t *, ptls_iovec_t *, struct st_ptls_esni_secret_t **, struct st_ptls_client_hello_t *)"
                       );
        }
        esni = &tls->esni;
        local_690 = (st_ptls_esni_secret_t *)calloc(1,200);
        puVar2 = ch.esni.record_digest;
        *esni = local_690;
        if (local_690 == (st_ptls_esni_secret_t *)0x0) goto LAB_0011acdb;
        local_7e0 = ppVar35->esni;
        iVar29 = 0x2f;
        goto LAB_001199dd;
      }
      if (ch.psk.early_data_indication == 0) {
        iVar30 = (*ptls_mem_equal)(tls->client_random,ch.random_bytes,0x20);
        iVar29 = 0x28;
        if (iVar30 != 0) {
          pcVar10 = tls->server_name;
          if (pcVar10 == (char *)0x0) goto LAB_00119b36;
          sVar36 = strlen(pcVar10);
          if (ch.server_name.len == sVar36) {
            iVar30 = bcmp(ch.server_name.base,pcVar10,sVar36);
            goto joined_r0x0011990f;
          }
        }
        goto LAB_00119b7e;
      }
    }
    iVar29 = 0x32;
    goto LAB_00119b7e;
  }
  iVar29 = iVar30;
  if ((long)puVar45 - (long)puVar50 < 2) goto LAB_00119b7e;
  uVar24 = *puVar50 << 8 | *puVar50 >> 8;
  if ((uVar24 < 0x40) && ((bitmap.bits[uVar24 >> 3] >> (uVar24 & 7) & 1) != 0)) {
LAB_0011958f:
    iVar29 = 0x2f;
    goto LAB_00119b7e;
  }
  extension_bitmap_set(&bitmap,uVar24);
  if ((ulong)((long)puVar45 - (long)(puVar50 + 1)) < 2) goto LAB_00119b7e;
  uVar25 = puVar50[1] << 8 | puVar50[1] >> 8;
  uVar46 = (ulong)uVar25;
  puVar33 = puVar50 + 2;
  session_id.base = (uint8_t *)puVar33;
  if ((ulong)((long)puVar45 - (long)puVar33) < uVar46) goto LAB_00119b7e;
  psVar7 = tls->ctx->on_extension;
  if ((psVar7 != (st_ptls_on_extension_t *)0x0) &&
     (pVar69.len._0_2_ = uVar25, pVar69.base = (uint8_t *)puVar33, pVar69.len._2_6_ = 0,
     iVar28 = (*psVar7->cb)(psVar7,tls,'\x01',uVar24,pVar69), iVar28 != 0)) {
    iVar29 = 1;
    goto LAB_00119b7e;
  }
  end = (ushort *)((long)puVar33 + uVar46);
  switch(uVar24) {
  case 0x29:
    if (uVar25 < 2) goto LAB_00119b7e;
    uVar46 = (ulong)(ushort)(puVar50[2] << 8 | puVar50[2] >> 8);
    session_id.base = (uint8_t *)(puVar50 + 3);
    if ((ulong)((long)end - (long)session_id.base) < uVar46) goto LAB_00119b7e;
    pbVar62 = (byte *)(uVar46 + (long)session_id.base);
    lVar47 = 1;
    do {
      local_800 = lVar47;
      finished_key[0x10] = '\0';
      finished_key[0x11] = '\0';
      finished_key[0x12] = '\0';
      finished_key[0x13] = '\0';
      finished_key[0x14] = '\0';
      finished_key[0x15] = '\0';
      finished_key[0x16] = '\0';
      finished_key[0x17] = '\0';
      finished_key[0x18] = '\0';
      finished_key[0x19] = '\0';
      finished_key[0x1a] = '\0';
      finished_key[0x1b] = '\0';
      finished_key[0x1c] = '\0';
      finished_key[0x1d] = '\0';
      finished_key[0x1e] = '\0';
      finished_key[0x1f] = '\0';
      finished_key[0x20] = '\0';
      finished_key[0x21] = '\0';
      finished_key[0x22] = '\0';
      finished_key[0x23] = '\0';
      finished_key[0x24] = '\0';
      finished_key[0x25] = '\0';
      finished_key[0x26] = '\0';
      finished_key[0x27] = '\0';
      finished_key[0] = '\0';
      finished_key[1] = '\0';
      finished_key[2] = '\0';
      finished_key[3] = '\0';
      finished_key[4] = '\0';
      finished_key[5] = '\0';
      finished_key[6] = '\0';
      finished_key[7] = '\0';
      finished_key[8] = '\0';
      finished_key[9] = '\0';
      finished_key[10] = '\0';
      finished_key[0xb] = '\0';
      finished_key[0xc] = '\0';
      finished_key[0xd] = '\0';
      finished_key[0xe] = '\0';
      finished_key[0xf] = '\0';
      iVar29 = iVar30;
      if ((ulong)((long)pbVar62 - (long)session_id.base) < 2) goto LAB_00119b7e;
      uVar46 = (ulong)(ushort)(*(ushort *)session_id.base << 8 | *(ushort *)session_id.base >> 8);
      puVar49 = session_id.base + 2;
      if ((ulong)((long)pbVar62 - (long)puVar49) < uVar46) goto LAB_00119b7e;
      session_id.base = puVar49 + uVar46;
      finished_key._0_8_ = puVar49;
      finished_key._8_8_ = uVar46;
      iVar29 = ptls_decode32((uint32_t *)(finished_key + 0x10),&session_id.base,pbVar62);
      sVar61 = ch.psk.identities.count;
      if (iVar29 != 0) goto LAB_00119b7e;
      if (ch.psk.identities.count < 4) {
        ch.psk.identities.count = ch.psk.identities.count + 1;
        ch.psk.identities.list[sVar61].binder.len = finished_key._32_8_;
        *(undefined8 *)&ch.psk.identities.list[sVar61].obfuscated_ticket_age = finished_key._16_8_;
        ch.psk.identities.list[sVar61].binder.base = (uint8_t *)finished_key._24_8_;
        ch.psk.identities.list[sVar61].identity.base = (uint8_t *)finished_key._0_8_;
        ch.psk.identities.list[sVar61].identity.len = finished_key._8_8_;
      }
      sVar61 = ch.psk.identities.count;
      lVar47 = local_800 + 1;
    } while (session_id.base != pbVar62);
    ch.psk.hash_end = session_id.base;
    iVar29 = iVar30;
    if ((ulong)((long)end - (long)pbVar62) < 2) goto LAB_00119b7e;
    uVar46 = (ulong)(ushort)(*(ushort *)session_id.base << 8 | *(ushort *)session_id.base >> 8);
    puVar50 = (ushort *)(session_id.base + 2);
    if ((ulong)((long)end - (long)puVar50) < uVar46) goto LAB_00119b7e;
    puVar33 = (ushort *)(uVar46 + (long)puVar50);
    psVar51 = &ch.psk.identities.list[0].binder.len;
    uVar46 = 0;
    do {
      if (puVar33 == puVar50) goto LAB_00119b7e;
      uVar44 = (ulong)(byte)*puVar50;
      pbVar62 = (byte *)((long)puVar50 + 1);
      if ((ulong)((long)puVar33 - (long)pbVar62) < uVar44) goto LAB_00119b7e;
      if (uVar46 < sVar61) {
        ((ptls_iovec_t *)(psVar51 + -1))->base = pbVar62;
        *psVar51 = uVar44;
      }
      puVar50 = (ushort *)(pbVar62 + uVar44);
      uVar46 = uVar46 + 1;
      local_800 = local_800 + -1;
      psVar51 = psVar51 + 5;
    } while (puVar50 != puVar33);
    if (local_800 != 0) goto LAB_0011958f;
    goto LAB_00119050;
  case 0x2a:
    ch.psk.early_data_indication = 1;
    puVar50 = end;
    goto LAB_00118904;
  case 0x2b:
    if (uVar46 == 0) goto LAB_00119b7e;
    session_id.base = (uint8_t *)((long)puVar50 + 5);
    if ((ulong)((long)end - (long)session_id.base) < (ulong)(byte)puVar50[2]) goto LAB_00119b7e;
    puVar33 = (ushort *)((ulong)(byte)puVar50[2] + (long)session_id.base);
    puVar50 = (ushort *)session_id.base;
    lVar47 = 4;
    do {
      if ((long)puVar33 - (long)puVar50 < 2) goto LAB_00119b7e;
      uVar25 = *puVar50;
      puVar50 = puVar50 + 1;
      lVar57 = 0;
      for (puVar59 = supported_versions;
          (lVar52 = lVar47, lVar47 != lVar57 &&
          (lVar52 = lVar57, *puVar59 != (uint16_t)(uVar25 << 8 | uVar25 >> 8)));
          puVar59 = puVar59 + 1) {
        lVar57 = lVar57 + 1;
      }
      lVar47 = lVar52;
    } while (puVar50 != puVar33);
    if (lVar52 != 4) {
      ch.selected_version = supported_versions[lVar52];
    }
    bVar67 = puVar33 == end;
    session_id.base = (uint8_t *)puVar33;
    break;
  case 0x2c:
    if ((properties == (ptls_handshake_properties_t *)0x0) ||
       ((properties->field_0).server.cookie.key == (void *)0x0)) goto LAB_0011958f;
    ch.cookie.all.base = (uint8_t *)puVar33;
    ch.cookie.all.len = uVar46;
    if (uVar46 < 2) goto LAB_00119b7e;
    uVar46 = (ulong)(ushort)(puVar50[2] << 8 | puVar50[2] >> 8);
    puVar33 = puVar50 + 3;
    if (((ulong)((long)end - (long)puVar33) < uVar46) ||
       (ch.cookie.tbs.base = (uint8_t *)puVar33, uVar46 < 2)) goto LAB_00119b7e;
    puVar32 = (ushort *)(uVar46 + (long)puVar33);
    uVar46 = (ulong)(ushort)(puVar50[3] << 8 | puVar50[3] >> 8);
    if (((ulong)((long)puVar32 - (long)(puVar50 + 4)) < uVar46) || (uVar46 == 0)) goto LAB_00119b7e;
    puVar53 = (ushort *)((long)(puVar50 + 4) + uVar46);
    uVar46 = (ulong)(byte)puVar50[4];
    pbVar62 = (byte *)((long)puVar50 + 9);
    if ((ulong)((long)puVar53 - (long)pbVar62) < uVar46) goto LAB_00119b7e;
    ch.cookie.ch1_hash.base = pbVar62;
    puVar50 = (ushort *)(pbVar62 + uVar46);
    ch.cookie.ch1_hash.len = uVar46;
    if (puVar50 == puVar53) goto LAB_00119b7e;
    if ((byte)*puVar50 == 1) {
      ch.cookie._64_1_ = ch.cookie._64_1_ | 1;
    }
    else {
      if ((byte)*puVar50 != 0) goto LAB_00119b7e;
      if ((ch.cookie._64_1_ & 1) != 0) {
        __assert_fail("!ch->cookie.sent_key_share",
                      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                      ,0xcd7,
                      "int decode_client_hello(ptls_t *, struct st_ptls_client_hello_t *, const uint8_t *, const uint8_t *const, ptls_handshake_properties_t *)"
                     );
      }
    }
    if (((ushort *)((long)puVar50 + 1) != puVar53) ||
       (ch.cookie.tbs.len = (long)puVar53 - (long)puVar33, puVar32 == puVar53)) goto LAB_00119b7e;
    session_id.base = (uint8_t *)(puVar50 + 1);
    uVar46 = (ulong)(byte)*puVar53;
    if ((ulong)((long)puVar32 - (long)session_id.base) < uVar46) goto LAB_00119b7e;
    ch.cookie.signature.base = session_id.base;
    ch.cookie.signature.len = uVar46;
    if ((ushort *)((long)session_id.base + uVar46) != puVar32) goto LAB_00119b7e;
    bVar67 = (ushort *)((long)session_id.base + uVar46) == end;
    break;
  case 0x2d:
    if (uVar46 == 0) goto LAB_00119b7e;
    session_id.base = (uint8_t *)((long)puVar50 + 5);
    uVar46 = (ulong)(byte)puVar50[2];
    if (((ulong)((long)end - (long)session_id.base) < uVar46) || (uVar46 == 0)) goto LAB_00119b7e;
    puVar33 = (ushort *)((long)puVar33 + uVar46 + 1);
    uVar31 = ch.psk.ke_modes;
    for (uVar44 = 0; uVar46 != uVar44; uVar44 = uVar44 + 1) {
      if (session_id.base[uVar44] < 0x20) {
        uVar31 = uVar31 | 1 << (session_id.base[uVar44] & 0x1f);
        ch.psk.ke_modes = uVar31;
      }
    }
    bVar67 = puVar33 == end;
    session_id.base = (uint8_t *)puVar33;
    break;
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
switchD_00118a95_caseD_2e:
    handle_unknown_extension
              (tls,properties,uVar24,(uint8_t *)puVar33,(uint8_t *)end,ch.unknown_extensions);
    puVar50 = end;
    goto LAB_00118904;
  case 0x33:
    ch.key_shares.base = (uint8_t *)puVar33;
    ch.key_shares.len = uVar46;
    puVar50 = end;
    goto LAB_00118904;
  default:
    if (uVar24 == 0xffce) {
      if (ch.esni.cipher == (ptls_cipher_suite_t *)0x0) {
        if (uVar25 < 2) goto LAB_00119b7e;
        session_id.base = (uint8_t *)(puVar50 + 3);
        pppVar55 = tls->ctx->cipher_suites;
        while( true ) {
          if (*pppVar55 == (ptls_cipher_suite_t *)0x0) goto LAB_0011958f;
          if ((*pppVar55)->id == (uint16_t)(puVar50[2] << 8 | puVar50[2] >> 8)) break;
          pppVar55 = pppVar55 + 1;
        }
        iVar29 = select_key_share(&ch.esni.key_share,&ch.esni.peer_key,tls->ctx->key_exchanges,
                                  &session_id.base,(uint8_t *)end,1);
        if ((iVar29 != 0) || (iVar29 = iVar30, (ulong)((long)end - (long)session_id.base) < 2))
        goto LAB_00119b7e;
        uVar46 = (ulong)(ushort)(*(ushort *)session_id.base << 8 | *(ushort *)session_id.base >> 8);
        puVar49 = session_id.base + 2;
        if ((ulong)((long)end - (long)puVar49) < uVar46) goto LAB_00119b7e;
        if (uVar46 != (*pppVar55)->hash->digest_size) goto LAB_0011958f;
        puVar50 = (ushort *)(puVar49 + uVar46);
        ch.esni.record_digest = puVar49;
        if ((ulong)((long)end - (long)puVar50) < 2) goto LAB_00119b7e;
        uVar46 = (ulong)(ushort)(*puVar50 << 8 | *puVar50 >> 8);
        puVar50 = puVar50 + 1;
        if ((ulong)((long)end - (long)puVar50) < uVar46) goto LAB_00119b7e;
        if ((*pppVar55)->aead->tag_size <= uVar46) {
          ch.esni.encrypted_sni.base = (uint8_t *)puVar50;
          ch.esni.encrypted_sni.len = uVar46;
          if ((ushort *)((long)puVar50 + uVar46) != end) goto LAB_00119b7e;
          ch.esni.cipher = *pppVar55;
          puVar50 = end;
          goto LAB_00118904;
        }
      }
      goto LAB_0011958f;
    }
    if (uVar24 == 5) {
      ch._1248_1_ = ch._1248_1_ | 1;
      puVar50 = end;
      goto LAB_00118904;
    }
    if (uVar24 == 10) {
      ch.negotiated_groups.base = (uint8_t *)puVar33;
      ch.negotiated_groups.len = uVar46;
      puVar50 = end;
      goto LAB_00118904;
    }
    if (uVar24 == 0xd) goto LAB_00118ef4;
    if (uVar24 == 0x10) {
      if (1 < uVar25) {
        uVar46 = (ulong)(ushort)(puVar50[2] << 8 | puVar50[2] >> 8);
        session_id.base = (uint8_t *)(puVar50 + 3);
        if (uVar46 <= (ulong)((long)end - (long)session_id.base)) {
          puVar33 = (ushort *)(uVar46 + (long)session_id.base);
          sVar61 = ch.alpn.count;
          puVar50 = (ushort *)session_id.base;
          do {
            if (puVar33 == puVar50) goto LAB_00119b7e;
            pbVar62 = (byte *)((long)puVar50 + 1);
            uVar46 = (ulong)(byte)*puVar50;
            if (((ulong)((long)puVar33 - (long)pbVar62) < uVar46) || (uVar46 == 0))
            goto LAB_00119b7e;
            puVar50 = (ushort *)((long)puVar50 + uVar46 + 1);
            uVar46 = sVar61;
            if (sVar61 < 0x10) {
              uVar46 = sVar61 + 1;
              ch.alpn.count = uVar46;
              ch.alpn.list[sVar61].base = pbVar62;
              ch.alpn.list[sVar61].len = (long)puVar50 - (long)pbVar62;
            }
            sVar61 = uVar46;
          } while (puVar50 != puVar33);
          goto LAB_00119050;
        }
      }
      goto LAB_00119b7e;
    }
    if (uVar24 != 0x1b) {
      if (uVar24 != 0) goto switchD_00118a95_caseD_2e;
      iVar29 = client_hello_decode_server_name(&ch.server_name,&session_id.base,(uint8_t *)end);
      if (iVar29 == 0) {
        bVar67 = (ushort *)session_id.base == end;
        break;
      }
      goto LAB_00119b7e;
    }
    if (uVar46 == 0) goto LAB_00119b7e;
    session_id.base = (uint8_t *)((long)puVar50 + 5);
    uVar46 = (ulong)(byte)puVar50[2];
    if ((ulong)((long)end - (long)session_id.base) < uVar46) goto LAB_00119b7e;
    puVar33 = (ushort *)(session_id.base + uVar46);
    puVar50 = puVar50 + 3;
    sVar61 = ch.cert_compression_algos.count;
    do {
      if ((long)uVar46 < 2) goto LAB_00119b7e;
      uVar44 = sVar61;
      if (sVar61 < 0x10) {
        uVar44 = sVar61 + 1;
        ch.cert_compression_algos.count = uVar44;
        ch.cert_compression_algos.list[sVar61] =
             *(ushort *)((long)puVar50 + -1) << 8 | *(ushort *)((long)puVar50 + -1) >> 8;
      }
      puVar50 = puVar50 + 1;
      uVar46 = uVar46 - 2;
      sVar61 = uVar44;
    } while (uVar46 != 0);
LAB_00119050:
    bVar67 = puVar33 == end;
  }
  puVar50 = end;
  iVar29 = iVar30;
  if (!bVar67) goto LAB_00119b7e;
  goto LAB_00118904;
LAB_001199dd:
  ppVar11 = *local_7e0;
  if (ppVar11 == (ptls_esni_context_t *)0x0) goto LAB_0011b085;
  puVar60 = ppVar11->cipher_suites[-1].record_digest;
  do {
    puVar1 = (undefined8 *)(puVar60 + 0x40);
    if ((uint16_t *)*puVar1 == (uint16_t *)0x0) goto LAB_0011b085;
    puVar60 = puVar60 + 0x48;
  } while (*(uint16_t *)*puVar1 != cipher->id);
  local_698 = cipher->hash;
  iVar30 = bcmp(puVar60,puVar2,local_698->digest_size);
  if (iVar30 == 0) {
    local_7d8 = (ptls_aead_context_t *)ppVar11->key_exchanges;
    goto LAB_0011a8d1;
  }
  local_7e0 = local_7e0 + 1;
  goto LAB_001199dd;
LAB_0011a8d1:
  if (*(st_ptls_key_exchange_context_t **)local_7d8 == (st_ptls_key_exchange_context_t *)0x0)
  goto LAB_0011b085;
  uVar4 = (*(st_ptls_key_exchange_context_t **)local_7d8)->algo->id;
  if (uVar4 == (ch.esni.key_share)->id) {
    pubkey_00.len = ch.esni.peer_key.len;
    pubkey_00.base = ch.esni.peer_key.base;
    iVar30 = build_esni_contents_hash
                       (local_698,local_690->esni_contents_hash,puVar2,uVar4,pubkey_00,puVar49);
    if ((iVar30 != 0) ||
       (pVar68.len = ch.esni.peer_key.len, pVar68.base = ch.esni.peer_key.base,
       iVar30 = (*(*(st_ptls_key_exchange_context_t **)local_7d8)->on_exchange)
                          ((st_ptls_key_exchange_context_t **)local_7d8,0,&(*esni)->secret,pVar68),
       iVar30 != 0)) {
      local_7f8 = (uint8_t *)0x0;
      local_7e8 = 0;
      local_7d8 = (ptls_aead_context_t *)0x0;
      local_7c0 = (uint8_t *)0x0;
      iVar29 = iVar30;
      goto LAB_0011b0a0;
    }
    sVar36 = ch.esni.encrypted_sni.len - cipher->aead->tag_size;
    local_7f8 = (uint8_t *)0x0;
    local_7e8 = 0;
    local_7d8 = (ptls_aead_context_t *)0x0;
    local_7c0 = (uint8_t *)0x0;
    if (sVar36 != (ulong)(*local_7e0)->padded_length + 0x10) goto LAB_0011b0a0;
    puVar49 = (uint8_t *)malloc(sVar36);
    if (puVar49 != (uint8_t *)0x0) {
      local_7f8 = (uint8_t *)0x0;
      iVar29 = create_esni_aead((ptls_aead_context_t **)&session_id,0,cipher,(*esni)->secret,
                                (*esni)->esni_contents_hash);
      puVar2 = session_id.base;
      local_7d8 = (ptls_aead_context_t *)session_id.base;
      local_7c0 = puVar49;
      if (iVar29 != 0) {
        local_7e8 = 0;
        goto LAB_0011b0a0;
      }
      local_7f8 = (uint8_t *)0x0;
      sVar61 = ptls_aead_decrypt((ptls_aead_context_t *)session_id.base,puVar49,
                                 ch.esni.encrypted_sni.base,ch.esni.encrypted_sni.len,0,
                                 ch.key_shares.base,ch.key_shares.len);
      if (sVar61 != (ulong)(*local_7e0)->padded_length + 0x10) {
        local_7e8 = 0;
        iVar29 = 0x33;
        goto LAB_0011b0a0;
      }
      ptls_aead_free((ptls_aead_context_t *)puVar2);
      if ((ulong)(*local_7e0)->padded_length < 0x10) goto LAB_0011b1eb;
      end_00 = (uint8_t  [8])((ulong)(*local_7e0)->padded_length + (long)puVar49);
      psVar15 = *esni;
      uVar18 = *(undefined8 *)(puVar49 + 8);
      *(undefined8 *)psVar15->nonce = *(undefined8 *)puVar49;
      *(undefined8 *)(psVar15->nonce + 8) = uVar18;
      bitmap.bits = (uint8_t  [8])((long)puVar49 + 0x10);
      iVar29 = client_hello_decode_server_name
                         ((ptls_iovec_t *)finished_key,(uint8_t **)&bitmap,(uint8_t *)end_00);
      sVar43.bits = bitmap.bits;
      if (iVar29 != 0) goto LAB_0011b245;
      goto LAB_0011b26d;
    }
    iVar29 = 0x201;
    goto LAB_0011b085;
  }
  local_7d8 = (ptls_aead_context_t *)((long)local_7d8 + 8);
  goto LAB_0011a8d1;
LAB_0011b085:
  local_7f8 = (uint8_t *)0x0;
  local_7e8 = 0;
  local_7d8 = (ptls_aead_context_t *)0x0;
  local_7c0 = (uint8_t *)0x0;
  goto LAB_0011b0a0;
LAB_00118ef4:
  iVar29 = decode_signature_algorithms(&ch.signature_algorithms,&session_id.base,(uint8_t *)end);
  puVar50 = end;
  if (iVar29 != 0) goto LAB_00119b7e;
  goto LAB_00118904;
  while (uVar3 = *(uint8_t *)sVar43.bits, sVar43.bits = sVar43.bits + 1, uVar3 == '\0') {
LAB_0011b26d:
    if (sVar43.bits == end_00) {
      local_7e8._0_1_ = finished_key[8];
      local_7e8._1_1_ = finished_key[9];
      local_7e8._2_1_ = finished_key[10];
      local_7e8._3_1_ = finished_key[0xb];
      local_7e8._4_1_ = finished_key[0xc];
      local_7e8._5_1_ = finished_key[0xd];
      local_7e8._6_1_ = finished_key[0xe];
      local_7e8._7_1_ = finished_key[0xf];
      memmove(puVar49,(void *)finished_key._0_8_,finished_key._8_8_);
      local_7d8 = (ptls_aead_context_t *)0x0;
      local_7c0 = (uint8_t *)0x0;
      iVar29 = 0;
      local_7f8 = puVar49;
      goto LAB_0011b0a0;
    }
  }
LAB_0011b1eb:
  iVar29 = 0x2f;
LAB_0011b245:
  local_7f8 = (uint8_t *)0x0;
  local_7e8 = 0;
  local_7d8 = (ptls_aead_context_t *)0x0;
LAB_0011b0a0:
  free(local_7c0);
  if (local_7d8 != (ptls_aead_context_t *)0x0) {
    ptls_aead_free(local_7d8);
  }
  if (iVar29 != 0) {
    if (*esni != (st_ptls_esni_secret_t *)0x0) {
      free_esni_secret(esni,1);
    }
    goto LAB_00119b7e;
  }
  ppVar35 = tls->ctx;
  psVar14 = ppVar35->update_esni_key;
  if (psVar14 != (st_ptls_update_esni_key_t *)0x0) {
    iVar29 = (*psVar14->cb)(psVar14,tls,tls->esni->secret,(ch.esni.cipher)->hash,
                            tls->esni->esni_contents_hash);
    if (iVar29 != 0) goto LAB_00119b7e;
    ppVar35 = tls->ctx;
  }
  bVar67 = false;
LAB_00119a8f:
  if (ppVar35->on_client_hello == (ptls_on_client_hello_t *)0x0) {
    iVar29 = 0;
  }
  else {
    finished_key._0_8_ = local_7f8;
    finished_key[8] = (undefined1)local_7e8;
    finished_key[9] = local_7e8._1_1_;
    finished_key[10] = local_7e8._2_1_;
    finished_key[0xb] = local_7e8._3_1_;
    finished_key[0xc] = local_7e8._4_1_;
    finished_key[0xd] = local_7e8._5_1_;
    finished_key[0xe] = local_7e8._6_1_;
    finished_key[0xf] = local_7e8._7_1_;
    finished_key._16_8_ = &ch.alpn;
    finished_key[0x18] = (undefined1)ch.alpn.count;
    finished_key[0x19] = ch.alpn.count._1_1_;
    finished_key[0x1a] = ch.alpn.count._2_1_;
    finished_key[0x1b] = ch.alpn.count._3_1_;
    finished_key[0x1c] = ch.alpn.count._4_1_;
    finished_key[0x1d] = ch.alpn.count._5_1_;
    finished_key[0x1e] = ch.alpn.count._6_1_;
    finished_key[0x1f] = ch.alpn.count._7_1_;
    finished_key._32_8_ = &ch.signature_algorithms;
    finished_key[0x28] = (undefined1)ch.signature_algorithms.count;
    finished_key[0x29] = ch.signature_algorithms.count._1_1_;
    finished_key[0x2a] = ch.signature_algorithms.count._2_1_;
    finished_key[0x2b] = ch.signature_algorithms.count._3_1_;
    finished_key[0x2c] = ch.signature_algorithms.count._4_1_;
    finished_key[0x2d] = ch.signature_algorithms.count._5_1_;
    finished_key[0x2e] = ch.signature_algorithms.count._6_1_;
    finished_key[0x2f] = ch.signature_algorithms.count._7_1_;
    finished_key._48_8_ = &ch.cert_compression_algos;
    finished_key[0x38] = (undefined1)ch.cert_compression_algos.count;
    finished_key[0x39] = ch.cert_compression_algos.count._1_1_;
    finished_key[0x3a] = ch.cert_compression_algos.count._2_1_;
    finished_key[0x3b] = ch.cert_compression_algos.count._3_1_;
    finished_key[0x3c] = ch.cert_compression_algos.count._4_1_;
    finished_key[0x3d] = ch.cert_compression_algos.count._5_1_;
    finished_key[0x3e] = ch.cert_compression_algos.count._6_1_;
    finished_key[0x3f] = ch.cert_compression_algos.count._7_1_;
    iVar29 = (*ppVar35->on_client_hello->cb)
                       (ppVar35->on_client_hello,tls,
                        (ptls_on_client_hello_parameters_t *)finished_key);
  }
  iVar30 = iVar29;
  if (!bVar67) {
    free(local_7f8);
  }
joined_r0x0011990f:
  if (iVar30 != 0) goto LAB_00119b7e;
LAB_00119b36:
  iVar29 = select_cipher((ptls_cipher_suite_t **)finished_key,tls->ctx->cipher_suites,
                         ch.cipher_suites.base,ch.cipher_suites.base + ch.cipher_suites.len);
  if (iVar29 != 0) goto LAB_00119b7e;
  if (eVar5 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
    if (tls->cipher_suite != (ptls_cipher_suite_t *)finished_key._0_8_) {
LAB_00119b7b:
      iVar29 = 0x28;
      goto LAB_00119b7e;
    }
  }
  else {
    tls->cipher_suite = (ptls_cipher_suite_t *)finished_key._0_8_;
    ppVar37 = key_schedule_new((ptls_cipher_suite_t *)finished_key._0_8_,(ptls_cipher_suite_t **)0x0
                               ,tls->ctx->hkdf_label_prefix__obsolete);
    tls->key_schedule = ppVar37;
  }
  if (ch.key_shares.base != (uint8_t *)0x0 &&
      key_share.algorithm == (ptls_key_exchange_algorithm_t *)0x0) {
    puVar2 = ch.key_shares.base + ch.key_shares.len;
    cVar23 = '\x03';
    puVar49 = ch.key_shares.base;
    if (ch.key_shares.len < 2) {
LAB_00119c49:
      iVar30 = 0x32;
    }
    else {
      uVar46 = (ulong)(ushort)(*(ushort *)ch.key_shares.base << 8 |
                              *(ushort *)ch.key_shares.base >> 8);
      puVar49 = ch.key_shares.base + 2;
      finished_key._0_8_ = puVar49;
      if (ch.key_shares.len - 2 < uVar46) goto LAB_00119c49;
      puVar60 = ch.key_shares.base + uVar46 + 2;
      iVar30 = select_key_share(&key_share.algorithm,&key_share.peer_key,tls->ctx->key_exchanges,
                                (uint8_t **)finished_key,puVar60,0);
      puVar49 = (uint8_t *)finished_key._0_8_;
      if (iVar30 == 0) {
        iVar30 = 0x32;
        if ((uint8_t *)finished_key._0_8_ == puVar60) {
          iVar30 = 0;
        }
        cVar23 = ((uint8_t *)finished_key._0_8_ != puVar60) * '\x03';
      }
    }
    iVar29 = 0x32;
    if (puVar49 == puVar2) {
      iVar29 = iVar30;
    }
    cVar21 = (puVar49 != puVar2) * '\x03';
    if (cVar23 != '\0') {
      iVar29 = iVar30;
      cVar21 = cVar23;
    }
    if (cVar21 == '\x03') goto LAB_00119b7e;
    if (cVar21 != '\0') {
      return iVar29;
    }
  }
  ppVar13 = key_share.algorithm;
  if (eVar5 != PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
    if (key_share.algorithm != (ptls_key_exchange_algorithm_t *)0x0 && ch.cookie.all.len != 0) {
      sVar61 = (*tls->ctx->cipher_suites)->hash->digest_size;
      tbs.len = ch.cookie.tbs.len;
      tbs.base = ch.cookie.tbs.base;
      iVar29 = calc_cookie_signature(tls,properties,key_share.algorithm,tbs,finished_key);
      if (((iVar29 != 0) || (iVar29 = 0x28, ch.cookie.signature.len != sVar61)) ||
         (iVar30 = (*ptls_mem_equal)(ch.cookie.signature.base,finished_key,sVar61), iVar30 == 0))
      goto LAB_00119b7e;
      key_schedule_update_ch1hash_prefix(tls->key_schedule);
      ptls__key_schedule_update_hash
                (tls->key_schedule,ch.cookie.ch1_hash.base,ch.cookie.ch1_hash.len);
      key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
      sVar61 = emitter->buf->off;
      iVar29 = (*emitter->begin_message)(emitter);
      if (iVar29 != 0) goto LAB_00119b7e;
      ppVar63 = emitter->buf;
      ppVar37 = tls->key_schedule;
      sVar65 = ppVar63->off;
      local_79d = 2;
      iVar29 = ptls_buffer__do_pushv(ppVar63,&local_79d,1);
      if ((iVar29 != 0) || (iVar29 = ptls_buffer__do_pushv(ppVar63,"",3), iVar29 != 0))
      goto LAB_00119b7e;
      local_7d8 = (ptls_aead_context_t *)ppVar63->off;
      local_70a = 0x303;
      iVar29 = ptls_buffer__do_pushv(emitter->buf,&local_70a,2);
      if ((iVar29 != 0) || (iVar29 = ptls_buffer_reserve(emitter->buf,0x20), iVar29 != 0))
      goto LAB_00119b7e;
      puVar49 = emitter->buf->base;
      sVar64 = emitter->buf->off;
      puVar2 = puVar49 + sVar64 + 0x10;
      puVar2[0] = 0xc2;
      puVar2[1] = 0xa2;
      puVar2[2] = '\x11';
      puVar2[3] = '\x16';
      puVar2[4] = 'z';
      puVar2[5] = 0xbb;
      puVar2[6] = 0x8c;
      puVar2[7] = '^';
      puVar2[8] = '\a';
      puVar2[9] = 0x9e;
      puVar2[10] = '\t';
      puVar2[0xb] = 0xe2;
      puVar2[0xc] = 200;
      puVar2[0xd] = 0xa8;
      puVar2[0xe] = '3';
      puVar2[0xf] = 0x9c;
      puVar49 = puVar49 + sVar64;
      puVar49[0] = 0xcf;
      puVar49[1] = '!';
      puVar49[2] = 0xad;
      puVar49[3] = 't';
      puVar49[4] = 0xe5;
      puVar49[5] = 0x9a;
      puVar49[6] = 'a';
      puVar49[7] = '\x11';
      puVar49[8] = 0xbe;
      puVar49[9] = '\x1d';
      puVar49[10] = 0x8c;
      puVar49[0xb] = '\x02';
      puVar49[0xc] = '\x1e';
      puVar49[0xd] = 'e';
      puVar49[0xe] = 0xb8;
      puVar49[0xf] = 0x91;
      ppVar58 = emitter->buf;
      psVar51 = &ppVar58->off;
      *psVar51 = *psVar51 + 0x20;
      iVar29 = ptls_buffer__do_pushv(ppVar58,"",1);
      if (iVar29 != 0) goto LAB_00119b7e;
      sVar64 = emitter->buf->off;
      iVar29 = ptls_buffer__do_pushv
                         (emitter->buf,ch.legacy_session_id.base,ch.legacy_session_id.len);
      if (iVar29 != 0) goto LAB_00119b7e;
      emitter->buf->base[sVar64 - 1] = (char)(int)emitter->buf->off - (char)sVar64;
      uVar24 = tls->cipher_suite->id;
      local_70c = uVar24 << 8 | uVar24 >> 8;
      iVar29 = ptls_buffer__do_pushv(emitter->buf,&local_70c,2);
      if (iVar29 != 0) goto LAB_00119b7e;
      local_79e = 0;
      iVar29 = ptls_buffer__do_pushv(emitter->buf,&local_79e,1);
      if ((iVar29 != 0) || (iVar29 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar29 != 0))
      goto LAB_00119b7e;
      local_7b8 = emitter->buf->off;
      local_70e = 0x2b00;
      iVar29 = ptls_buffer__do_pushv(emitter->buf,&local_70e,2);
      if ((iVar29 != 0) || (iVar29 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar29 != 0))
      goto LAB_00119b7e;
      local_7c8 = emitter->buf->off;
      local_710 = ch.selected_version << 8 | ch.selected_version >> 8;
      iVar29 = ptls_buffer__do_pushv(emitter->buf,&local_710,2);
      if (iVar29 != 0) goto LAB_00119b7e;
      uVar46 = emitter->buf->off - local_7c8;
      for (lVar47 = 8; lVar47 != -8; lVar47 = lVar47 + -8) {
        emitter->buf->base[local_7c8 - 2] = (uint8_t)(uVar46 >> ((byte)lVar47 & 0x3f));
        local_7c8 = local_7c8 + 1;
      }
      ppVar58 = emitter->buf;
      if ((ch.cookie._64_1_ & 1) != 0) {
        local_712 = 0x3300;
        iVar29 = ptls_buffer__do_pushv(ppVar58,&local_712,2);
        if ((iVar29 != 0) || (iVar29 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar29 != 0))
        goto LAB_00119b7e;
        local_7c8 = emitter->buf->off;
        local_714 = ppVar13->id << 8 | ppVar13->id >> 8;
        iVar29 = ptls_buffer__do_pushv(emitter->buf,&local_714,2);
        if (iVar29 != 0) goto LAB_00119b7e;
        uVar46 = emitter->buf->off - local_7c8;
        for (lVar47 = 8; lVar47 != -8; lVar47 = lVar47 + -8) {
          emitter->buf->base[local_7c8 - 2] = (uint8_t)(uVar46 >> ((byte)lVar47 & 0x3f));
          local_7c8 = local_7c8 + 1;
        }
        ppVar58 = emitter->buf;
      }
      local_716 = 0x2c00;
      iVar29 = ptls_buffer__do_pushv(ppVar58,&local_716,2);
      if ((iVar29 != 0) || (iVar29 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar29 != 0))
      goto LAB_00119b7e;
      local_7e8 = emitter->buf->off;
      iVar29 = ptls_buffer__do_pushv(emitter->buf,ch.cookie.all.base,ch.cookie.all.len);
      if (iVar29 != 0) goto LAB_00119b7e;
      uVar46 = emitter->buf->off - local_7e8;
      for (lVar47 = 8; lVar47 != -8; lVar47 = lVar47 + -8) {
        emitter->buf->base[local_7e8 - 2] = (uint8_t)(uVar46 >> ((byte)lVar47 & 0x3f));
        local_7e8 = local_7e8 + 1;
      }
      uVar46 = emitter->buf->off - local_7b8;
      for (lVar47 = 8; lVar47 != -8; lVar47 = lVar47 + -8) {
        emitter->buf->base[local_7b8 - 2] = (uint8_t)(uVar46 >> ((byte)lVar47 & 0x3f));
        local_7b8 = local_7b8 + 1;
      }
      uVar46 = ppVar63->off - (long)local_7d8;
      for (lVar47 = 0x10; lVar47 != -8; lVar47 = lVar47 + -8) {
        ppVar63->base[(long)local_7d8 - 3] = (uint8_t)(uVar46 >> ((byte)lVar47 & 0x3f));
        local_7d8 = (ptls_aead_context_t *)((long)local_7d8 + 1);
      }
      if (ppVar37 != (ptls_key_schedule_t *)0x0) {
        ptls__key_schedule_update_hash(ppVar37,ppVar63->base + sVar65,ppVar63->off - sVar65);
      }
      iVar29 = (*emitter->commit_message)(emitter);
      if (iVar29 != 0) goto LAB_00119b7e;
      emitter->buf->off = sVar61;
      goto LAB_00119c83;
    }
    if (key_share.algorithm != (ptls_key_exchange_algorithm_t *)0x0) {
      bVar67 = true;
      if ((properties != (ptls_handshake_properties_t *)0x0) &&
         (bVar67 = true, (*(byte *)((long)&properties->field_0 + 0x60) & 1) != 0))
      goto LAB_0011a2d8;
      goto LAB_00119c8b;
    }
LAB_0011a2d8:
    if (ch.negotiated_groups.base == (uint8_t *)0x0) {
      iVar29 = 0x6d;
      goto LAB_00119b7e;
    }
    iVar29 = 0x32;
    if ((ch.negotiated_groups.len < 2) ||
       (uVar46 = (ulong)(ushort)(*(ushort *)ch.negotiated_groups.base << 8 |
                                *(ushort *)ch.negotiated_groups.base >> 8),
       ch.negotiated_groups.len - 2 < uVar46)) goto LAB_00119b7e;
    puVar50 = (ushort *)(ch.negotiated_groups.base + uVar46 + 2);
    puVar40 = (ushort *)ch.negotiated_groups.base;
    while (puVar40 = puVar40 + 1, puVar40 != puVar50) {
      if ((long)puVar50 - (long)puVar40 < 2) goto LAB_00119b7e;
      pppVar39 = tls->ctx->key_exchanges;
      while (negotiated_group = *pppVar39, negotiated_group != (ptls_key_exchange_algorithm_t *)0x0)
      {
        pppVar39 = pppVar39 + 1;
        if (negotiated_group->id == (uint16_t)(*puVar40 << 8 | *puVar40 >> 8)) {
          ptls__key_schedule_update_hash(tls->key_schedule,puVar41,uVar42);
          if (tls->key_schedule->generation != 0) {
            __assert_fail("tls->key_schedule->generation == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                          ,0xe8a,
                          "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                         );
          }
          if ((properties == (ptls_handshake_properties_t *)0x0) ||
             ((*(byte *)((long)&properties->field_0 + 0x60) & 2) == 0)) {
            key_schedule_transform_post_ch1hash(tls->key_schedule);
            key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
            iVar29 = (*emitter->begin_message)(emitter);
            if (iVar29 == 0) {
              ppVar63 = emitter->buf;
              ppVar37 = tls->key_schedule;
              sVar61 = ppVar63->off;
              local_7a2 = 2;
              iVar29 = ptls_buffer__do_pushv(ppVar63,&local_7a2,1);
              if ((iVar29 == 0) && (iVar29 = ptls_buffer__do_pushv(ppVar63,"",3), iVar29 == 0)) {
                local_7f8 = (uint8_t *)ppVar63->off;
                local_726 = 0x303;
                iVar29 = ptls_buffer__do_pushv(emitter->buf,&local_726,2);
                if ((iVar29 == 0) && (iVar29 = ptls_buffer_reserve(emitter->buf,0x20), iVar29 == 0))
                {
                  puVar41 = emitter->buf->base;
                  sVar65 = emitter->buf->off;
                  puVar49 = puVar41 + sVar65 + 0x10;
                  puVar49[0] = 0xc2;
                  puVar49[1] = 0xa2;
                  puVar49[2] = '\x11';
                  puVar49[3] = '\x16';
                  puVar49[4] = 'z';
                  puVar49[5] = 0xbb;
                  puVar49[6] = 0x8c;
                  puVar49[7] = '^';
                  puVar49[8] = '\a';
                  puVar49[9] = 0x9e;
                  puVar49[10] = '\t';
                  puVar49[0xb] = 0xe2;
                  puVar49[0xc] = 200;
                  puVar49[0xd] = 0xa8;
                  puVar49[0xe] = '3';
                  puVar49[0xf] = 0x9c;
                  puVar41 = puVar41 + sVar65;
                  puVar41[0] = 0xcf;
                  puVar41[1] = '!';
                  puVar41[2] = 0xad;
                  puVar41[3] = 't';
                  puVar41[4] = 0xe5;
                  puVar41[5] = 0x9a;
                  puVar41[6] = 'a';
                  puVar41[7] = '\x11';
                  puVar41[8] = 0xbe;
                  puVar41[9] = '\x1d';
                  puVar41[10] = 0x8c;
                  puVar41[0xb] = '\x02';
                  puVar41[0xc] = '\x1e';
                  puVar41[0xd] = 'e';
                  puVar41[0xe] = 0xb8;
                  puVar41[0xf] = 0x91;
                  ppVar58 = emitter->buf;
                  psVar51 = &ppVar58->off;
                  *psVar51 = *psVar51 + 0x20;
                  iVar29 = ptls_buffer__do_pushv(ppVar58,"",1);
                  if (iVar29 == 0) {
                    sVar65 = emitter->buf->off;
                    iVar29 = ptls_buffer__do_pushv
                                       (emitter->buf,ch.legacy_session_id.base,
                                        ch.legacy_session_id.len);
                    if (iVar29 == 0) {
                      emitter->buf->base[sVar65 - 1] = (char)(int)emitter->buf->off - (char)sVar65;
                      uVar24 = tls->cipher_suite->id;
                      local_728 = uVar24 << 8 | uVar24 >> 8;
                      iVar29 = ptls_buffer__do_pushv(emitter->buf,&local_728,2);
                      if (iVar29 == 0) {
                        local_7a3 = 0;
                        iVar29 = ptls_buffer__do_pushv(emitter->buf,&local_7a3,1);
                        if ((iVar29 == 0) &&
                           (iVar29 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar29 == 0)) {
                          local_7e0 = (ptls_esni_context_t **)emitter->buf->off;
                          local_72a = 0x2b00;
                          iVar29 = ptls_buffer__do_pushv(emitter->buf,&local_72a,2);
                          if ((iVar29 == 0) &&
                             (iVar29 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar29 == 0)) {
                            local_7f0 = emitter->buf->off;
                            local_72c = ch.selected_version << 8 | ch.selected_version >> 8;
                            iVar29 = ptls_buffer__do_pushv(emitter->buf,&local_72c,2);
                            if (iVar29 == 0) {
                              uVar42 = emitter->buf->off - local_7f0;
                              for (lVar47 = 8; lVar47 != -8; lVar47 = lVar47 + -8) {
                                emitter->buf->base[local_7f0 - 2] =
                                     (uint8_t)(uVar42 >> ((byte)lVar47 & 0x3f));
                                local_7f0 = local_7f0 + 1;
                              }
                              ppVar58 = emitter->buf;
                              if (ppVar13 == (ptls_key_exchange_algorithm_t *)0x0) {
                                local_72e = 0x3300;
                                iVar29 = ptls_buffer__do_pushv(ppVar58,&local_72e,2);
                                if ((iVar29 != 0) ||
                                   (iVar29 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar29 != 0))
                                goto LAB_00119b7e;
                                local_7e8 = emitter->buf->off;
                                local_730 = negotiated_group->id << 8 | negotiated_group->id >> 8;
                                iVar29 = ptls_buffer__do_pushv(emitter->buf,&local_730,2);
                                if (iVar29 != 0) goto LAB_00119b7e;
                                uVar42 = emitter->buf->off - local_7e8;
                                for (lVar47 = 8; lVar47 != -8; lVar47 = lVar47 + -8) {
                                  emitter->buf->base[local_7e8 - 2] =
                                       (uint8_t)(uVar42 >> ((byte)lVar47 & 0x3f));
                                  local_7e8 = local_7e8 + 1;
                                }
                                ppVar58 = emitter->buf;
                              }
                              uVar42 = ppVar58->off - (long)local_7e0;
                              for (lVar47 = 8; lVar47 != -8; lVar47 = lVar47 + -8) {
                                emitter->buf->base[(long)local_7e0 - 2] =
                                     (uint8_t)(uVar42 >> ((byte)lVar47 & 0x3f));
                                local_7e0 = (ptls_esni_context_t **)((long)local_7e0 + 1);
                              }
                              uVar42 = ppVar63->off - (long)local_7f8;
                              for (lVar47 = 0x10; lVar47 != -8; lVar47 = lVar47 + -8) {
                                ppVar63->base[(long)local_7f8 - 3] =
                                     (uint8_t)(uVar42 >> ((byte)lVar47 & 0x3f));
                                local_7f8 = (uint8_t *)((long)local_7f8 + 1);
                              }
                              if (ppVar37 != (ptls_key_schedule_t *)0x0) {
                                ptls__key_schedule_update_hash
                                          (ppVar37,ppVar63->base + sVar61,ppVar63->off - sVar61);
                              }
                              iVar29 = (*emitter->commit_message)(emitter);
                              if ((iVar29 == 0) &&
                                 (iVar29 = push_change_cipher_spec(tls,emitter->buf), iVar29 == 0))
                              {
                                tls->state = PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO;
                                iVar29 = 0x202;
                                if (ch.psk.early_data_indication != 0) {
                                  (tls->field_20).server.early_data_skipped_bytes = 0;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            goto LAB_00119b7e;
          }
          iVar29 = (*emitter->begin_message)(emitter);
          if (iVar29 == 0) {
            ppVar63 = emitter->buf;
            local_79f = 2;
            iVar29 = ptls_buffer__do_pushv(ppVar63,&local_79f,1);
            if ((iVar29 == 0) && (iVar29 = ptls_buffer__do_pushv(ppVar63,"",3), iVar29 == 0)) {
              local_7f8 = (uint8_t *)ppVar63->off;
              local_718 = 0x303;
              iVar29 = ptls_buffer__do_pushv(emitter->buf,&local_718,2);
              if ((iVar29 == 0) && (iVar29 = ptls_buffer_reserve(emitter->buf,0x20), iVar29 == 0)) {
                puVar41 = emitter->buf->base;
                sVar61 = emitter->buf->off;
                puVar49 = puVar41 + sVar61 + 0x10;
                puVar49[0] = 0xc2;
                puVar49[1] = 0xa2;
                puVar49[2] = '\x11';
                puVar49[3] = '\x16';
                puVar49[4] = 'z';
                puVar49[5] = 0xbb;
                puVar49[6] = 0x8c;
                puVar49[7] = '^';
                puVar49[8] = '\a';
                puVar49[9] = 0x9e;
                puVar49[10] = '\t';
                puVar49[0xb] = 0xe2;
                puVar49[0xc] = 200;
                puVar49[0xd] = 0xa8;
                puVar49[0xe] = '3';
                puVar49[0xf] = 0x9c;
                puVar41 = puVar41 + sVar61;
                puVar41[0] = 0xcf;
                puVar41[1] = '!';
                puVar41[2] = 0xad;
                puVar41[3] = 't';
                puVar41[4] = 0xe5;
                puVar41[5] = 0x9a;
                puVar41[6] = 'a';
                puVar41[7] = '\x11';
                puVar41[8] = 0xbe;
                puVar41[9] = '\x1d';
                puVar41[10] = 0x8c;
                puVar41[0xb] = '\x02';
                puVar41[0xc] = '\x1e';
                puVar41[0xd] = 'e';
                puVar41[0xe] = 0xb8;
                puVar41[0xf] = 0x91;
                ppVar58 = emitter->buf;
                psVar51 = &ppVar58->off;
                *psVar51 = *psVar51 + 0x20;
                iVar29 = ptls_buffer__do_pushv(ppVar58,"",1);
                if (iVar29 == 0) {
                  sVar61 = emitter->buf->off;
                  iVar29 = ptls_buffer__do_pushv
                                     (emitter->buf,ch.legacy_session_id.base,
                                      ch.legacy_session_id.len);
                  if (iVar29 == 0) {
                    emitter->buf->base[sVar61 - 1] = (char)(int)emitter->buf->off - (char)sVar61;
                    uVar24 = tls->cipher_suite->id;
                    local_71a = uVar24 << 8 | uVar24 >> 8;
                    iVar29 = ptls_buffer__do_pushv(emitter->buf,&local_71a,2);
                    if (iVar29 == 0) {
                      local_7a0 = 0;
                      iVar29 = ptls_buffer__do_pushv(emitter->buf,&local_7a0,1);
                      if ((iVar29 == 0) &&
                         (iVar29 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar29 == 0)) {
                        local_7f0 = emitter->buf->off;
                        local_71c = 0x2b00;
                        iVar29 = ptls_buffer__do_pushv(emitter->buf,&local_71c,2);
                        if ((iVar29 == 0) &&
                           (iVar29 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar29 == 0)) {
                          sVar61 = emitter->buf->off;
                          local_71e = ch.selected_version << 8 | ch.selected_version >> 8;
                          iVar29 = ptls_buffer__do_pushv(emitter->buf,&local_71e,2);
                          if (iVar29 == 0) {
                            uVar42 = emitter->buf->off - sVar61;
                            for (; local_7b8 != -8; local_7b8 = local_7b8 + -8) {
                              emitter->buf->base[sVar61 - 2] =
                                   (uint8_t)(uVar42 >> ((byte)local_7b8 & 0x3f));
                              sVar61 = sVar61 + 1;
                            }
                            ppVar58 = emitter->buf;
                            if (ppVar13 == (ptls_key_exchange_algorithm_t *)0x0) {
                              local_720 = 0x3300;
                              iVar29 = ptls_buffer__do_pushv(ppVar58,&local_720,2);
                              if ((iVar29 != 0) ||
                                 (iVar29 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar29 != 0))
                              goto LAB_00119b7e;
                              sVar61 = emitter->buf->off;
                              local_722 = negotiated_group->id << 8 | negotiated_group->id >> 8;
                              iVar29 = ptls_buffer__do_pushv(emitter->buf,&local_722,2);
                              if (iVar29 != 0) goto LAB_00119b7e;
                              uVar42 = emitter->buf->off - sVar61;
                              for (lVar47 = 8; lVar47 != -8; lVar47 = lVar47 + -8) {
                                emitter->buf->base[sVar61 - 2] =
                                     (uint8_t)(uVar42 >> ((byte)lVar47 & 0x3f));
                                sVar61 = sVar61 + 1;
                              }
                              ppVar58 = emitter->buf;
                            }
                            local_724 = 0x2c00;
                            iVar29 = ptls_buffer__do_pushv(ppVar58,&local_724,2);
                            if ((iVar29 == 0) &&
                               (iVar29 = ptls_buffer__do_pushv(ppVar58,"",2), iVar29 == 0)) {
                              sVar61 = ppVar58->off;
                              iVar29 = ptls_buffer__do_pushv(ppVar58,"",2);
                              if (iVar29 == 0) {
                                sVar65 = ppVar58->off;
                                iVar29 = ptls_buffer__do_pushv(ppVar58,"",2);
                                if (iVar29 == 0) {
                                  sVar64 = ppVar58->off;
                                  iVar29 = ptls_buffer__do_pushv(ppVar58,"",1);
                                  if (iVar29 == 0) {
                                    sVar17 = ppVar58->off;
                                    sVar48 = tls->cipher_suite->hash->digest_size;
                                    iVar29 = ptls_buffer_reserve(ppVar58,sVar48);
                                    if (iVar29 == 0) {
                                      psVar34 = tls->key_schedule->hashes[0].ctx;
                                      (*psVar34->final)(psVar34,ppVar58->base + ppVar58->off,
                                                        PTLS_HASH_FINAL_MODE_RESET);
                                      sVar48 = sVar48 + ppVar58->off;
                                      local_7a1 = ppVar13 == (ptls_key_exchange_algorithm_t *)0x0;
                                      ppVar58->off = sVar48;
                                      ppVar58->base[sVar17 - 1] = (char)sVar48 - (char)sVar17;
                                      iVar29 = ptls_buffer__do_pushv(ppVar58,&local_7a1,1);
                                      if (iVar29 == 0) {
                                        lVar47 = ppVar58->off - sVar64;
                                        ppVar58->base[sVar64 - 2] = (uint8_t)((ulong)lVar47 >> 8);
                                        ppVar58->base[sVar64 - 1] = (uint8_t)lVar47;
                                        sVar64 = ppVar58->off;
                                        iVar29 = ptls_buffer__do_pushv(ppVar58,"",1);
                                        if (iVar29 == 0) {
                                          sVar17 = ppVar58->off;
                                          sVar48 = (*tls->ctx->cipher_suites)->hash->digest_size;
                                          iVar29 = ptls_buffer_reserve(ppVar58,sVar48);
                                          if ((iVar29 == 0) &&
                                             (tbs_00.len = sVar64 - sVar65,
                                             tbs_00.base = ppVar58->base + sVar65,
                                             iVar29 = calc_cookie_signature
                                                                (tls,properties,negotiated_group,
                                                                 tbs_00,ppVar58->base + ppVar58->off
                                                                ), iVar29 == 0)) {
                                            sVar48 = sVar48 + ppVar58->off;
                                            ppVar58->off = sVar48;
                                            ppVar58->base[sVar17 - 1] = (char)sVar48 - (char)sVar17;
                                            lVar47 = ppVar58->off - sVar65;
                                            ppVar58->base[sVar65 - 2] =
                                                 (uint8_t)((ulong)lVar47 >> 8);
                                            ppVar58->base[sVar65 - 1] = (uint8_t)lVar47;
                                            lVar47 = ppVar58->off - sVar61;
                                            ppVar58->base[sVar61 - 2] =
                                                 (uint8_t)((ulong)lVar47 >> 8);
                                            ppVar58->base[sVar61 - 1] = (uint8_t)lVar47;
                                            uVar42 = emitter->buf->off - local_7f0;
                                            for (lVar47 = 8; lVar47 != -8; lVar47 = lVar47 + -8) {
                                              emitter->buf->base[local_7f0 - 2] =
                                                   (uint8_t)(uVar42 >> ((byte)lVar47 & 0x3f));
                                              local_7f0 = local_7f0 + 1;
                                            }
                                            uVar42 = ppVar63->off - (long)local_7f8;
                                            for (lVar47 = 0x10; lVar47 != -8; lVar47 = lVar47 + -8)
                                            {
                                              ppVar63->base[(long)local_7f8 - 3] =
                                                   (uint8_t)(uVar42 >> ((byte)lVar47 & 0x3f));
                                              local_7f8 = (uint8_t *)((long)local_7f8 + 1);
                                            }
                                            iVar29 = (*emitter->commit_message)(emitter);
                                            if (iVar29 == 0) {
                                              iVar30 = push_change_cipher_spec(tls,emitter->buf);
                                              iVar29 = 0x206;
                                              if (iVar30 != 0) {
                                                iVar29 = iVar30;
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          goto LAB_00119b7e;
        }
      }
    }
    puVar41 = (uint8_t *)
              ((long)puVar50 - (long)(ch.negotiated_groups.base + ch.negotiated_groups.len));
    iVar30 = 0x28;
    iVar29 = 0x32;
LAB_0011ad3c:
    if (puVar41 == (uint8_t *)0x0) {
      iVar29 = iVar30;
    }
    goto LAB_00119b7e;
  }
LAB_00119c83:
  bVar67 = false;
LAB_00119c8b:
  iVar29 = report_unknown_extensions(tls,properties,ch.unknown_extensions);
  if (iVar29 != 0) goto LAB_00119b7e;
  bVar66 = false;
  if (((((bool)(ch.psk.hash_end != (uint8_t *)0x0 & bVar67)) && ((ch.psk.ke_modes & 3) != 0)) &&
      (ppVar35 = tls->ctx, ppVar35->encrypt_ticket != (ptls_encrypt_ticket_t *)0x0)) &&
     ((ppVar35->field_0x68 & 8) == 0)) {
    sVar61 = (long)ch.psk.hash_end - (long)puVar41;
    uVar38 = (*ppVar35->get_time->cb)(ppVar35->get_time);
    decbuf.base = finished_key;
    decbuf.off = 0;
    decbuf.capacity = 0x100;
    decbuf.is_allocated = 0;
    for (local_800 = 0; local_800 < ch.psk.identities.count; local_800 = local_800 + 1) {
      decbuf.off = 0;
      psVar12 = tls->ctx->encrypt_ticket;
      pVar70.len = ch.psk.identities.list[local_800].identity.len;
      pVar70.base = ch.psk.identities.list[local_800].identity.base;
      iVar29 = (*psVar12->cb)(psVar12,tls,0,&decbuf,pVar70);
      if ((iVar29 == 0) &&
         (iVar29 = decode_session_identifier
                             (&issue_at,(ptls_iovec_t *)&ticket_age_add,&age_add,&ticket_server_name
                              ,&ticket_key_exchange_id,&ticket_csid,&ticket_negotiated_protocol,
                              decbuf.base,decbuf.base + decbuf.off), iVar29 == 0)) {
        uVar46 = CONCAT71(issue_at._1_7_,(undefined1)issue_at);
        if ((uVar46 <= uVar38) &&
           (ppVar35 = tls->ctx, uVar38 - uVar46 <= (ulong)ppVar35->ticket_lifetime * 1000)) {
          if (ch.psk.early_data_indication == 0) {
            bVar66 = false;
          }
          else {
            uVar44 = uVar38 - (uVar46 + (ch.psk.identities.list[local_800].obfuscated_ticket_age -
                                        age_add));
            uVar46 = -uVar44;
            if (0 < (long)uVar44) {
              uVar46 = uVar44;
            }
            bVar66 = uVar46 < 0x2711;
          }
          pcVar10 = tls->server_name;
          if (ticket_server_name.len == 0) {
            if (pcVar10 == (char *)0x0) goto LAB_00119e95;
          }
          else if ((pcVar10 != (char *)0x0) &&
                  (x.base._1_1_ = ticket_server_name.base._1_1_,
                  x.base._0_1_ = ticket_server_name.base._0_1_,
                  x.base._2_2_ = ticket_server_name.base._2_2_,
                  x.base._4_4_ = ticket_server_name.base._4_4_, x.len = ticket_server_name.len,
                  iVar29 = vec_is_string(x,pcVar10), iVar29 != 0)) {
LAB_00119e95:
            pppVar39 = ppVar35->key_exchanges;
            do {
              ppVar13 = *pppVar39;
              if (ppVar13 == (ptls_key_exchange_algorithm_t *)0x0) goto LAB_00119e04;
              pppVar39 = pppVar39 + 1;
            } while (ppVar13->id != ticket_key_exchange_id);
            tls->key_share = ppVar13;
            if ((ticket_csid == tls->cipher_suite->id) &&
               ((((ticket_negotiated_protocol.len == 0 ||
                  ((tls->negotiated_protocol != (char *)0x0 &&
                   (x_00.base._2_6_ = ticket_negotiated_protocol.base._2_6_,
                   x_00.base._0_2_ = (ushort)ticket_negotiated_protocol.base,
                   x_00.len = ticket_negotiated_protocol.len,
                   iVar29 = vec_is_string(x_00,tls->negotiated_protocol), iVar29 != 0)))) &&
                 (local_6a0 == (tls->key_schedule->hashes[0].algo)->digest_size)) &&
                (ch.psk.identities.list[local_800].binder.len == local_6a0)))) {
              ikm_00.base._4_4_ = uStack_6a4;
              ikm_00.base._0_4_ = ticket_age_add;
              ikm_00.len = local_6a0;
              iVar29 = key_schedule_extract(tls->key_schedule,ikm_00);
              if ((iVar29 == 0) &&
                 (iVar29 = derive_secret(tls->key_schedule,&session_id,"res binder"), iVar29 == 0))
              {
                ptls__key_schedule_update_hash(tls->key_schedule,puVar41,sVar61);
                iVar29 = calc_verify_data(&bitmap,tls->key_schedule,&session_id);
                if (iVar29 == 0) {
                  iVar30 = (*ptls_mem_equal)(ch.psk.identities.list[local_800].binder.base,&bitmap,
                                             (tls->key_schedule->hashes[0].algo)->digest_size);
                  iVar29 = 0x33;
                  if (iVar30 != 0) {
                    iVar29 = 0;
                  }
                }
              }
              goto LAB_0011a98f;
            }
          }
        }
      }
LAB_00119e04:
    }
    tls->key_share = (ptls_key_exchange_algorithm_t *)0x0;
    bVar66 = false;
    local_800 = 0xffffffffffffffff;
    iVar29 = 0;
LAB_0011a98f:
    ptls_buffer_dispose(&decbuf);
    (*ptls_clear_memory)(&session_id,0x40);
    (*ptls_clear_memory)(&bitmap,0x40);
    if (iVar29 != 0) goto LAB_00119b7e;
    if (local_800 == 0xffffffffffffffff) goto LAB_0011aa14;
    if ((tls->ctx->field_0x68 & 8) != 0) goto LAB_0011aa1c;
    ptls__key_schedule_update_hash
              (tls->key_schedule,ch.psk.hash_end,(long)puVar40 - (long)ch.psk.hash_end);
    if ((ch.psk.ke_modes & 1) == 0) {
      if ((ch.psk.ke_modes & 2) == 0) {
        __assert_fail("(ch.psk.ke_modes & (1u << PTLS_PSK_KE_MODE_PSK_DHE)) != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                      ,0xee4,
                      "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      iVar30 = 2;
    }
    else {
      iVar30 = 1;
    }
    tls->field_0x160 = tls->field_0x160 | 2;
    if (properties != (ptls_handshake_properties_t *)0x0) {
      sVar36 = ch.psk.identities.list[local_800].binder.len;
      memcpy(properties,ch.psk.identities.list[local_800].binder.base,sVar36);
      goto LAB_0011aa53;
    }
  }
  else {
LAB_0011aa14:
    local_800 = 0xffffffffffffffff;
LAB_0011aa1c:
    ptls__key_schedule_update_hash(tls->key_schedule,puVar41,uVar42);
    if (bVar67) {
      if (tls->key_schedule->generation != 0) {
        __assert_fail("tls->key_schedule->generation == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                      ,0xed9,
                      "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
    }
    iVar30 = 0;
    if (properties != (ptls_handshake_properties_t *)0x0) {
      sVar36 = 0;
      iVar30 = 0;
LAB_0011aa53:
      *(size_t *)((long)&properties->field_0 + 0x40) = sVar36;
    }
  }
  if (((bVar66) && (local_800 == 0)) && (tls->ctx->max_early_data_size != 0)) {
    puVar41 = (uint8_t *)malloc(0x40);
    tls->pending_handshake_secret = puVar41;
    if (puVar41 == (uint8_t *)0x0) {
LAB_0011acdb:
      iVar29 = 0x201;
      goto LAB_00119b7e;
    }
    iVar29 = derive_exporter_secret(tls,1);
    if ((iVar29 != 0) || (iVar29 = setup_traffic_protection(tls,0,"c e traffic",1,0), iVar29 != 0))
    goto LAB_00119b7e;
  }
  ppVar13 = key_share.algorithm;
  if (iVar30 != 1) {
    if (key_share.algorithm == (ptls_key_exchange_algorithm_t *)0x0) {
      iVar30 = 0x6d;
      iVar29 = 0x28;
      puVar41 = ch.key_shares.base;
      goto LAB_0011ad3c;
    }
    pVar22.len = key_share.peer_key.len;
    pVar22.base = key_share.peer_key.base;
    iVar29 = (*(key_share.algorithm)->exchange)(key_share.algorithm,&pubkey,&ecdh_secret,pVar22);
    if (iVar29 != 0) goto LAB_00119b7e;
    tls->key_share = ppVar13;
  }
  iVar29 = (*emitter->begin_message)(emitter);
  if (iVar29 != 0) goto LAB_00119b7e;
  ppVar63 = emitter->buf;
  ppVar37 = tls->key_schedule;
  sVar61 = ppVar63->off;
  local_7a4 = 2;
  iVar29 = ptls_buffer__do_pushv(ppVar63,&local_7a4,1);
  if ((iVar29 != 0) || (iVar29 = ptls_buffer__do_pushv(ppVar63,"",3), iVar29 != 0))
  goto LAB_00119b7e;
  local_7f0 = ppVar63->off;
  local_732 = 0x303;
  iVar29 = ptls_buffer__do_pushv(emitter->buf,&local_732,2);
  if ((iVar29 != 0) || (iVar29 = ptls_buffer_reserve(emitter->buf,0x20), iVar29 != 0))
  goto LAB_00119b7e;
  (*tls->ctx->random_bytes)(emitter->buf->base + emitter->buf->off,0x20);
  ppVar58 = emitter->buf;
  psVar51 = &ppVar58->off;
  *psVar51 = *psVar51 + 0x20;
  iVar29 = ptls_buffer__do_pushv(ppVar58,"",1);
  if (iVar29 != 0) goto LAB_00119b7e;
  sVar65 = emitter->buf->off;
  iVar29 = ptls_buffer__do_pushv(emitter->buf,ch.legacy_session_id.base,ch.legacy_session_id.len);
  if (iVar29 != 0) goto LAB_00119b7e;
  emitter->buf->base[sVar65 - 1] = (char)(int)emitter->buf->off - (char)sVar65;
  uVar24 = tls->cipher_suite->id;
  local_734 = uVar24 << 8 | uVar24 >> 8;
  iVar29 = ptls_buffer__do_pushv(emitter->buf,&local_734,2);
  if (iVar29 != 0) goto LAB_00119b7e;
  local_7a5 = 0;
  iVar29 = ptls_buffer__do_pushv(emitter->buf,&local_7a5,1);
  if ((iVar29 != 0) || (iVar29 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar29 != 0))
  goto LAB_00119b7e;
  local_7d8 = (ptls_aead_context_t *)emitter->buf->off;
  local_736 = 0x2b00;
  iVar29 = ptls_buffer__do_pushv(emitter->buf,&local_736,2);
  if ((iVar29 != 0) || (iVar29 = ptls_buffer__do_pushv(emitter->buf,"",2), iVar29 != 0))
  goto LAB_00119b7e;
  local_7e0 = (ptls_esni_context_t **)emitter->buf->off;
  local_738 = ch.selected_version << 8 | ch.selected_version >> 8;
  iVar29 = ptls_buffer__do_pushv(emitter->buf,&local_738,2);
  if (iVar29 != 0) goto LAB_00119b7e;
  uVar42 = emitter->buf->off - (long)local_7e0;
  for (lVar47 = 8; lVar47 != -8; lVar47 = lVar47 + -8) {
    emitter->buf->base[(long)local_7e0 - 2] = (uint8_t)(uVar42 >> ((byte)lVar47 & 0x3f));
    local_7e0 = (ptls_esni_context_t **)((long)local_7e0 + 1);
  }
  ppVar58 = emitter->buf;
  if (iVar30 == 1) {
LAB_0011b3f3:
    local_73e = 0x2900;
    iVar29 = ptls_buffer__do_pushv(ppVar58,&local_73e,2);
    if ((iVar29 != 0) || (iVar29 = ptls_buffer__do_pushv(ppVar58,"",2), iVar29 != 0))
    goto LAB_00119b7e;
    sVar65 = ppVar58->off;
    local_740 = (ushort)local_800 << 8 | (ushort)local_800 >> 8;
    iVar29 = ptls_buffer__do_pushv(ppVar58,&local_740,2);
    if (iVar29 != 0) goto LAB_00119b7e;
    lVar47 = ppVar58->off - sVar65;
    ppVar58->base[sVar65 - 2] = (uint8_t)((ulong)lVar47 >> 8);
    ppVar58->base[sVar65 - 1] = (uint8_t)lVar47;
  }
  else {
    local_73a = 0x3300;
    iVar29 = ptls_buffer__do_pushv(ppVar58,&local_73a,2);
    if ((iVar29 != 0) || (iVar29 = ptls_buffer__do_pushv(ppVar58,"",2), iVar29 != 0))
    goto LAB_00119b7e;
    sVar65 = ppVar58->off;
    local_73c = (key_share.algorithm)->id << 8 | (key_share.algorithm)->id >> 8;
    iVar29 = ptls_buffer__do_pushv(ppVar58,&local_73c,2);
    if ((iVar29 != 0) || (iVar29 = ptls_buffer__do_pushv(ppVar58,"",2), iVar29 != 0))
    goto LAB_00119b7e;
    sVar64 = ppVar58->off;
    iVar29 = ptls_buffer__do_pushv(ppVar58,pubkey.base,pubkey.len);
    if (iVar29 != 0) goto LAB_00119b7e;
    lVar47 = ppVar58->off - sVar64;
    ppVar58->base[sVar64 - 2] = (uint8_t)((ulong)lVar47 >> 8);
    ppVar58->base[sVar64 - 1] = (uint8_t)lVar47;
    lVar47 = ppVar58->off - sVar65;
    ppVar58->base[sVar65 - 2] = (uint8_t)((ulong)lVar47 >> 8);
    ppVar58->base[sVar65 - 1] = (uint8_t)lVar47;
    if (iVar30 != 0) goto LAB_0011b3f3;
  }
  uVar42 = emitter->buf->off - (long)local_7d8;
  for (lVar47 = 8; lVar47 != -8; lVar47 = lVar47 + -8) {
    emitter->buf->base[(long)local_7d8 - 2] = (uint8_t)(uVar42 >> ((byte)lVar47 & 0x3f));
    local_7d8 = (ptls_aead_context_t *)((long)local_7d8 + 1);
  }
  uVar42 = ppVar63->off - local_7f0;
  for (lVar47 = 0x10; lVar47 != -8; lVar47 = lVar47 + -8) {
    ppVar63->base[local_7f0 - 3] = (uint8_t)(uVar42 >> ((byte)lVar47 & 0x3f));
    local_7f0 = local_7f0 + 1;
  }
  if (ppVar37 != (ptls_key_schedule_t *)0x0) {
    ptls__key_schedule_update_hash(ppVar37,ppVar63->base + sVar61,ppVar63->off - sVar61);
  }
  iVar29 = (*emitter->commit_message)(emitter);
  if ((iVar29 != 0) || (iVar29 = push_change_cipher_spec(tls,emitter->buf), iVar29 != 0))
  goto LAB_00119b7e;
  if (tls->key_schedule->generation != 1) {
    __assert_fail("tls->key_schedule->generation == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                  ,0xf19,
                  "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                 );
  }
  ikm.len = ecdh_secret.len;
  ikm.base = ecdh_secret.base;
  key_schedule_extract(tls->key_schedule,ikm);
  iVar29 = setup_traffic_protection(tls,1,"s hs traffic",2,0);
  if (iVar29 != 0) goto LAB_00119b7e;
  if (tls->pending_handshake_secret == (uint8_t *)0x0) {
    iVar29 = setup_traffic_protection(tls,0,"c hs traffic",2,0);
    if (iVar29 != 0) goto LAB_00119b7e;
    if (ch.psk.early_data_indication != 0) {
      (tls->field_20).server.early_data_skipped_bytes = 0;
    }
  }
  else {
    iVar29 = derive_secret(tls->key_schedule,tls->pending_handshake_secret,"c hs traffic");
    if ((iVar29 != 0) ||
       ((psVar16 = tls->ctx->update_traffic_key, psVar16 != (st_ptls_update_traffic_key_t *)0x0 &&
        (iVar29 = (*psVar16->cb)(psVar16,tls,0,2,tls->pending_handshake_secret), iVar29 != 0))))
    goto LAB_00119b7e;
  }
  iVar29 = (*emitter->begin_message)(emitter);
  if (iVar29 != 0) goto LAB_00119b7e;
  ppVar63 = emitter->buf;
  ppVar37 = tls->key_schedule;
  sVar61 = ppVar63->off;
  local_7a6 = 8;
  iVar29 = ptls_buffer__do_pushv(ppVar63,&local_7a6,1);
  if ((iVar29 != 0) || (iVar29 = ptls_buffer__do_pushv(ppVar63,"",3), iVar29 != 0))
  goto LAB_00119b7e;
  local_7f8 = (uint8_t *)ppVar63->off;
  ppVar58 = emitter->buf;
  iVar29 = ptls_buffer__do_pushv(ppVar58,"",2);
  if (iVar29 != 0) goto LAB_00119b7e;
  sVar65 = ppVar58->off;
  if (tls->esni == (st_ptls_esni_secret_t *)0x0) {
    if (tls->server_name != (char *)0x0) {
      local_744 = 0;
      iVar29 = ptls_buffer__do_pushv(ppVar58,&local_744,2);
      if ((iVar29 != 0) || (iVar29 = ptls_buffer__do_pushv(ppVar58,"",2), iVar29 != 0))
      goto LAB_00119b7e;
      sVar64 = ppVar58->off;
      for (lVar47 = -2; lVar47 != 0; lVar47 = lVar47 + 1) {
        ppVar58->base[lVar47 + sVar64] = '\0';
      }
    }
  }
  else {
    local_742 = 0xceff;
    iVar29 = ptls_buffer__do_pushv(ppVar58,&local_742,2);
    if ((iVar29 != 0) || (iVar29 = ptls_buffer__do_pushv(ppVar58,"",2), iVar29 != 0))
    goto LAB_00119b7e;
    sVar64 = ppVar58->off;
    iVar29 = ptls_buffer__do_pushv(ppVar58,tls->esni->nonce,0x10);
    if (iVar29 != 0) goto LAB_00119b7e;
    lVar47 = ppVar58->off - sVar64;
    ppVar58->base[sVar64 - 2] = (uint8_t)((ulong)lVar47 >> 8);
    ppVar58->base[sVar64 - 1] = (uint8_t)lVar47;
    free_esni_secret(&tls->esni,1);
  }
  if (tls->negotiated_protocol != (char *)0x0) {
    local_746 = 0x1000;
    iVar29 = ptls_buffer__do_pushv(ppVar58,&local_746,2);
    if ((iVar29 != 0) || (iVar29 = ptls_buffer__do_pushv(ppVar58,"",2), iVar29 != 0))
    goto LAB_00119b7e;
    sVar64 = ppVar58->off;
    iVar29 = ptls_buffer__do_pushv(ppVar58,"",2);
    if (iVar29 != 0) goto LAB_00119b7e;
    sVar17 = ppVar58->off;
    iVar29 = ptls_buffer__do_pushv(ppVar58,"",1);
    if (iVar29 != 0) goto LAB_00119b7e;
    sVar48 = ppVar58->off;
    pcVar10 = tls->negotiated_protocol;
    sVar36 = strlen(pcVar10);
    iVar29 = ptls_buffer__do_pushv(ppVar58,pcVar10,sVar36);
    if (iVar29 != 0) goto LAB_00119b7e;
    ppVar58->base[sVar48 - 1] = (char)(int)ppVar58->off - (char)sVar48;
    lVar47 = ppVar58->off - sVar17;
    ppVar58->base[sVar17 - 2] = (uint8_t)((ulong)lVar47 >> 8);
    ppVar58->base[sVar17 - 1] = (uint8_t)lVar47;
    lVar47 = ppVar58->off - sVar64;
    ppVar58->base[sVar64 - 2] = (uint8_t)((ulong)lVar47 >> 8);
    ppVar58->base[sVar64 - 1] = (uint8_t)lVar47;
  }
  if (tls->pending_handshake_secret != (uint8_t *)0x0) {
    local_748 = 0x2a00;
    iVar29 = ptls_buffer__do_pushv(ppVar58,&local_748,2);
    if ((iVar29 != 0) || (iVar29 = ptls_buffer__do_pushv(ppVar58,"",2), iVar29 != 0))
    goto LAB_00119b7e;
    sVar64 = ppVar58->off;
    for (lVar47 = -2; lVar47 != 0; lVar47 = lVar47 + 1) {
      ppVar58->base[lVar47 + sVar64] = '\0';
    }
  }
  iVar29 = push_additional_extensions(properties,ppVar58);
  if (iVar29 != 0) goto LAB_00119b7e;
  lVar47 = ppVar58->off - sVar65;
  ppVar58->base[sVar65 - 2] = (uint8_t)((ulong)lVar47 >> 8);
  ppVar58->base[sVar65 - 1] = (uint8_t)lVar47;
  uVar42 = ppVar63->off - (long)local_7f8;
  for (lVar47 = 0x10; lVar47 != -8; lVar47 = lVar47 + -8) {
    ppVar63->base[(long)local_7f8 - 3] = (uint8_t)(uVar42 >> ((byte)lVar47 & 0x3f));
    local_7f8 = (uint8_t *)((long)local_7f8 + 1);
  }
  if (ppVar37 != (ptls_key_schedule_t *)0x0) {
    ptls__key_schedule_update_hash(ppVar37,ppVar63->base + sVar61,ppVar63->off - sVar61);
  }
  iVar29 = (*emitter->commit_message)(emitter);
  if (iVar29 != 0) goto LAB_00119b7e;
  if (iVar30 == 0) {
    if ((tls->ctx->field_0x68 & 8) != 0) {
      iVar29 = (*emitter->begin_message)(emitter);
      if (iVar29 != 0) goto LAB_00119b7e;
      ppVar63 = emitter->buf;
      ppVar37 = tls->key_schedule;
      sVar61 = ppVar63->off;
      local_7a7 = 0xd;
      iVar29 = ptls_buffer__do_pushv(ppVar63,&local_7a7,1);
      if ((iVar29 != 0) || (iVar29 = ptls_buffer__do_pushv(ppVar63,"",3), iVar29 != 0))
      goto LAB_00119b7e;
      local_800 = ppVar63->off;
      ppVar58 = emitter->buf;
      local_7a8 = 0;
      iVar29 = ptls_buffer__do_pushv(ppVar58,&local_7a8,1);
      if ((iVar29 != 0) || (iVar29 = ptls_buffer__do_pushv(ppVar58,"",2), iVar29 != 0))
      goto LAB_00119b7e;
      sVar65 = ppVar58->off;
      local_74a = 0xd00;
      iVar29 = ptls_buffer__do_pushv(ppVar58,&local_74a,2);
      if ((iVar29 != 0) || (iVar29 = ptls_buffer__do_pushv(ppVar58,"",2), iVar29 != 0))
      goto LAB_00119b7e;
      sVar64 = ppVar58->off;
      iVar29 = push_signature_algorithms(ppVar58);
      if (iVar29 != 0) goto LAB_00119b7e;
      lVar47 = ppVar58->off - sVar64;
      ppVar58->base[sVar64 - 2] = (uint8_t)((ulong)lVar47 >> 8);
      ppVar58->base[sVar64 - 1] = (uint8_t)lVar47;
      lVar47 = ppVar58->off - sVar65;
      ppVar58->base[sVar65 - 2] = (uint8_t)((ulong)lVar47 >> 8);
      ppVar58->base[sVar65 - 1] = (uint8_t)lVar47;
      uVar42 = ppVar63->off - local_800;
      for (lVar47 = 0x10; lVar47 != -8; lVar47 = lVar47 + -8) {
        ppVar63->base[local_800 - 3] = (uint8_t)(uVar42 >> ((byte)lVar47 & 0x3f));
        local_800 = local_800 + 1;
      }
      if (ppVar37 != (ptls_key_schedule_t *)0x0) {
        ptls__key_schedule_update_hash(ppVar37,ppVar63->base + sVar61,ppVar63->off - sVar61);
      }
      iVar29 = (*emitter->commit_message)(emitter);
      if (iVar29 != 0) goto LAB_00119b7e;
    }
LAB_00119289:
    iVar29 = send_certificate_and_certificate_verify
                       (tls,emitter,&ch.signature_algorithms,(ptls_iovec_t)ZEXT816(0),
                        "TLS 1.3, server CertificateVerify",(byte)ch._1248_1_ & 1);
    if ((tls->field_0x160 & 0x20) != 0) {
      tls->handshake_ke_modes = ch.psk.ke_modes;
      return 0x202;
    }
    if (iVar29 != 0) goto LAB_00119b7e;
  }
  send_finished(tls,emitter);
  if (tls->key_schedule->generation != 2) {
    __assert_fail("tls->key_schedule->generation == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                  ,0xf6f,
                  "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                 );
  }
  iVar29 = key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
  if ((((iVar29 != 0) || (iVar29 = setup_traffic_protection(tls,1,"s ap traffic",3,0), iVar29 != 0))
      || (iVar29 = derive_secret(tls->key_schedule,&tls->field_20,"c ap traffic"), iVar29 != 0)) ||
     (iVar29 = derive_exporter_secret(tls,0), iVar29 != 0)) goto LAB_00119b7e;
  ppVar35 = tls->ctx;
  if (tls->pending_handshake_secret == (uint8_t *)0x0) {
    if ((ppVar35->field_0x68 & 8) == 0) {
      tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
    }
    else {
      tls->state = PTLS_STATE_SERVER_EXPECT_CERTIFICATE;
    }
  }
  else if ((ppVar35->field_0x68 & 0x10) == 0) {
    tls->state = PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA;
  }
  else {
    iVar29 = commission_handshake_secret(tls);
    if (iVar29 != 0) goto LAB_00119b7e;
    tls->state = PTLS_STATE_SERVER_EXPECT_FINISHED;
    ppVar35 = tls->ctx;
  }
  if ((ch.psk.ke_modes != 0) && (ppVar35->ticket_lifetime != 0)) {
    psVar34 = tls->key_schedule->hashes[0].ctx;
    psVar34 = (*psVar34->clone_)(psVar34);
    ppVar35 = tls->ctx;
    if (ppVar35->ticket_lifetime == 0) {
      __assert_fail("tls->ctx->ticket_lifetime != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                    ,0x54b,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
    }
    if (ppVar35->encrypt_ticket == (ptls_encrypt_ticket_t *)0x0) {
      __assert_fail("tls->ctx->encrypt_ticket != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                    ,0x54c,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
    }
    ppVar63 = emitter->buf;
    sVar61 = ppVar63->off;
    if ((tls->pending_handshake_secret == (uint8_t *)0x0) || ((ppVar35->field_0x68 & 0x10) != 0)) {
LAB_0011948b:
      ppVar37 = tls->key_schedule;
      age_add = CONCAT31(age_add._1_3_,0x14);
      iVar29 = ptls_buffer__do_pushv(ppVar63,&age_add,1);
      if ((iVar29 == 0) && (iVar29 = ptls_buffer__do_pushv(ppVar63,"",3), iVar29 == 0)) {
        sVar65 = ppVar63->off;
        iVar29 = ptls_buffer_reserve(emitter->buf,(tls->key_schedule->hashes[0].algo)->digest_size);
        if (iVar29 == 0) {
          secret = &tls->traffic_protection;
          if ((anon_struct_176_2_4ca0e81c_for_traffic_protection *)tls->pending_handshake_secret !=
              (anon_struct_176_2_4ca0e81c_for_traffic_protection *)0x0) {
            secret = (anon_struct_176_2_4ca0e81c_for_traffic_protection *)
                     tls->pending_handshake_secret;
          }
          iVar29 = calc_verify_data(emitter->buf->base + emitter->buf->off,tls->key_schedule,secret)
          ;
          if (iVar29 == 0) {
            psVar51 = &emitter->buf->off;
            *psVar51 = *psVar51 + (tls->key_schedule->hashes[0].algo)->digest_size;
            uVar42 = ppVar63->off - sVar65;
            for (lVar47 = 0x10; lVar47 != -8; lVar47 = lVar47 + -8) {
              ppVar63->base[sVar65 - 3] = (uint8_t)(uVar42 >> ((byte)lVar47 & 0x3f));
              sVar65 = sVar65 + 1;
            }
            if (ppVar37 != (ptls_key_schedule_t *)0x0) {
              ptls__key_schedule_update_hash(ppVar37,ppVar63->base + sVar61,ppVar63->off - sVar61);
            }
            emitter->buf->off = sVar61;
            (*tls->ctx->random_bytes)(&ticket_age_add,4);
            uVar6 = ticket_age_add;
            session_id.base = finished_key;
            session_id.off = 0;
            session_id.capacity = 0x80;
            session_id.is_allocated = 0;
            ppVar35 = tls->ctx;
            ppVar37 = tls->key_schedule;
            pcVar10 = tls->server_name;
            uVar4 = tls->key_share->id;
            uVar24 = tls->cipher_suite->id;
            __s = tls->negotiated_protocol;
            iVar29 = ptls_buffer__do_pushv(&session_id,"",2);
            sVar61 = session_id.off;
            if ((iVar29 == 0) &&
               (iVar29 = ptls_buffer__do_pushv(&session_id,"ptls0001",8), iVar29 == 0)) {
              psVar9 = ppVar35->get_time;
              uVar38 = (*psVar9->cb)(psVar9);
              bitmap.bits = (uint8_t  [8])
                            (uVar38 >> 0x38 | (uVar38 & 0xff000000000000) >> 0x28 |
                             (uVar38 & 0xff0000000000) >> 0x18 | (uVar38 & 0xff00000000) >> 8 |
                             (uVar38 & 0xff000000) << 8 | (uVar38 & 0xff0000) << 0x18 |
                             (uVar38 & 0xff00) << 0x28 | uVar38 << 0x38);
              local_7d0 = 8;
              iVar29 = ptls_buffer__do_pushv(&session_id,&bitmap,8);
              if ((iVar29 == 0) &&
                 (((iVar29 = ptls_buffer__do_pushv(&session_id,"",2), sVar65 = session_id.off,
                   iVar29 == 0 &&
                   (iVar29 = ptls_buffer_reserve(&session_id,(ppVar37->hashes[0].algo)->digest_size)
                   , sVar64 = session_id.off, puVar41 = session_id.base, iVar29 == 0)) &&
                  (iVar29 = derive_resumption_secret
                                      (ppVar37,session_id.base + session_id.off,
                                       (ptls_iovec_t)ZEXT816(0)), iVar29 == 0)))) {
                session_id.off = sVar64 + (ppVar37->hashes[0].algo)->digest_size;
                puVar41[sVar65 - 2] = (uint8_t)(session_id.off - sVar65 >> 8);
                puVar41[sVar65 - 1] = (uint8_t)(session_id.off - sVar65);
                ticket_server_name.base._0_1_ = (undefined1)(uVar4 >> 8);
                ticket_server_name.base._1_1_ = (undefined1)uVar4;
                iVar29 = ptls_buffer__do_pushv(&session_id,&ticket_server_name,2);
                if (iVar29 == 0) {
                  ticket_negotiated_protocol.base._0_2_ = uVar24 << 8 | uVar24 >> 8;
                  iVar29 = ptls_buffer__do_pushv(&session_id,&ticket_negotiated_protocol,2);
                  if (iVar29 == 0) {
                    decbuf.base = (uint8_t *)
                                  CONCAT44(decbuf.base._4_4_,
                                           uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 |
                                           (uVar6 & 0xff00) << 8 | uVar6 << 0x18);
                    iVar29 = ptls_buffer__do_pushv(&session_id,&decbuf,4);
                    if ((iVar29 == 0) &&
                       (iVar29 = ptls_buffer__do_pushv(&session_id,"",2), sVar65 = session_id.off,
                       iVar29 == 0)) {
                      sVar26 = (short)session_id.off;
                      sVar27 = sVar26;
                      if (pcVar10 != (char *)0x0) {
                        sVar36 = strlen(pcVar10);
                        iVar29 = ptls_buffer__do_pushv(&session_id,pcVar10,sVar36);
                        if (iVar29 != 0) goto LAB_001194be;
                        sVar27 = (short)session_id.off;
                      }
                      uVar24 = sVar27 - sVar26;
                      *(ushort *)(session_id.base + (sVar65 - 2)) = uVar24 * 0x100 | uVar24 >> 8;
                      iVar29 = ptls_buffer__do_pushv(&session_id,"",1);
                      sVar65 = session_id.off;
                      if (iVar29 == 0) {
                        if (__s != (char *)0x0) {
                          sVar36 = strlen(__s);
                          iVar29 = ptls_buffer__do_pushv(&session_id,__s,sVar36);
                          if (iVar29 != 0) goto LAB_001194be;
                        }
                        sVar64 = session_id.off;
                        puVar41 = session_id.base;
                        session_id.base[sVar65 - 1] = (char)session_id.off - (char)sVar65;
                        session_id.base[sVar61 - 2] = (uint8_t)(session_id.off - sVar61 >> 8);
                        session_id.base[sVar61 - 1] = (uint8_t)(session_id.off - sVar61);
                        iVar29 = (*emitter->begin_message)(emitter);
                        if (iVar29 == 0) {
                          ppVar63 = emitter->buf;
                          ppVar37 = tls->key_schedule;
                          sVar61 = ppVar63->off;
                          ticket_key_exchange_id = CONCAT11(ticket_key_exchange_id._1_1_,4);
                          iVar29 = ptls_buffer__do_pushv(ppVar63,&ticket_key_exchange_id,1);
                          if ((iVar29 == 0) &&
                             (iVar29 = ptls_buffer__do_pushv(ppVar63,"",3), iVar29 == 0)) {
                            local_7e0 = (ptls_esni_context_t **)ppVar63->off;
                            uVar31 = tls->ctx->ticket_lifetime;
                            uVar31 = uVar31 >> 0x18 | (uVar31 & 0xff0000) >> 8 |
                                     (uVar31 & 0xff00) << 8 | uVar31 << 0x18;
                            bitmap.bits[0] = (char)uVar31;
                            bitmap.bits[1] = (char)(uVar31 >> 8);
                            bitmap.bits[2] = (char)(uVar31 >> 0x10);
                            bitmap.bits[3] = (char)(uVar31 >> 0x18);
                            iVar29 = ptls_buffer__do_pushv(emitter->buf,&bitmap,4);
                            if (iVar29 == 0) {
                              decbuf.base = (uint8_t *)
                                            CONCAT44(decbuf.base._4_4_,
                                                     ticket_age_add >> 0x18 |
                                                     (ticket_age_add & 0xff0000) >> 8 |
                                                     (ticket_age_add & 0xff00) << 8 |
                                                     ticket_age_add << 0x18);
                              iVar29 = ptls_buffer__do_pushv(emitter->buf,&decbuf,4);
                              if ((iVar29 == 0) &&
                                 (iVar29 = ptls_buffer__do_pushv(emitter->buf,"",1), iVar29 == 0)) {
                                emitter->buf->base[emitter->buf->off - 1] = '\0';
                                iVar29 = ptls_buffer__do_pushv(emitter->buf,"",2);
                                if (iVar29 == 0) {
                                  local_7d8 = (ptls_aead_context_t *)emitter->buf->off;
                                  psVar12 = tls->ctx->encrypt_ticket;
                                  pVar71.len = sVar64;
                                  pVar71.base = puVar41;
                                  iVar29 = (*psVar12->cb)(psVar12,tls,1,emitter->buf,pVar71);
                                  if (iVar29 == 0) {
                                    uVar42 = emitter->buf->off - (long)local_7d8;
                                    for (; local_7d0 != -8; local_7d0 = local_7d0 + -8) {
                                      emitter->buf->base[(long)local_7d8 - 2] =
                                           (uint8_t)(uVar42 >> ((byte)local_7d0 & 0x3f));
                                      local_7d8 = (ptls_aead_context_t *)((long)local_7d8 + 1);
                                    }
                                    iVar29 = ptls_buffer__do_pushv(emitter->buf,"",2);
                                    if (iVar29 == 0) {
                                      sVar65 = emitter->buf->off;
                                      sVar64 = sVar65;
                                      if (tls->ctx->max_early_data_size == 0) {
LAB_0011b69f:
                                        uVar42 = sVar64 - sVar65;
                                        for (lVar47 = 8; lVar47 != -8; lVar47 = lVar47 + -8) {
                                          emitter->buf->base[sVar65 - 2] =
                                               (uint8_t)(uVar42 >> ((byte)lVar47 & 0x3f));
                                          sVar65 = sVar65 + 1;
                                        }
                                        uVar42 = ppVar63->off - (long)local_7e0;
                                        for (lVar47 = 0x10; lVar47 != -8; lVar47 = lVar47 + -8) {
                                          ppVar63->base[(long)local_7e0 - 3] =
                                               (uint8_t)(uVar42 >> ((byte)lVar47 & 0x3f));
                                          local_7e0 = (ptls_esni_context_t **)((long)local_7e0 + 1);
                                        }
                                        if (ppVar37 != (ptls_key_schedule_t *)0x0) {
                                          ptls__key_schedule_update_hash
                                                    (ppVar37,ppVar63->base + sVar61,
                                                     ppVar63->off - sVar61);
                                        }
                                        iVar29 = (*emitter->commit_message)(emitter);
                                      }
                                      else {
                                        ticket_negotiated_protocol.base._0_2_ = 0x2a00;
                                        iVar29 = ptls_buffer__do_pushv
                                                           (emitter->buf,&ticket_negotiated_protocol
                                                            ,2);
                                        if ((iVar29 == 0) &&
                                           (iVar29 = ptls_buffer__do_pushv(emitter->buf,"",2),
                                           iVar29 == 0)) {
                                          sVar64 = emitter->buf->off;
                                          uVar6 = tls->ctx->max_early_data_size;
                                          ticket_server_name.base._1_1_ =
                                               (undefined1)(uVar6 >> 0x10);
                                          ticket_server_name.base._2_2_ =
                                               (ushort)(uVar6 >> 8) & 0xff |
                                               (ushort)((uVar6 << 0x18) >> 0x10);
                                          ticket_server_name.base._0_1_ =
                                               (undefined1)(uVar6 >> 0x18);
                                          iVar29 = ptls_buffer__do_pushv
                                                             (emitter->buf,&ticket_server_name,4);
                                          if (iVar29 == 0) {
                                            uVar42 = emitter->buf->off - sVar64;
                                            for (lVar47 = 8; lVar47 != -8; lVar47 = lVar47 + -8) {
                                              emitter->buf->base[sVar64 - 2] =
                                                   (uint8_t)(uVar42 >> ((byte)lVar47 & 0x3f));
                                              sVar64 = sVar64 + 1;
                                            }
                                            sVar64 = emitter->buf->off;
                                            goto LAB_0011b69f;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      if (tls->state != PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
        __assert_fail("tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA",
                      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                      ,0x551,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
      }
      ppVar37 = tls->key_schedule;
      issue_at._0_1_ = 5;
      iVar29 = ptls_buffer__do_pushv(ppVar63,&issue_at,1);
      if ((iVar29 == 0) && (iVar29 = ptls_buffer__do_pushv(ppVar63,"",3), iVar29 == 0)) {
        sVar65 = ppVar63->off;
        for (lVar47 = -3; lVar47 != 0; lVar47 = lVar47 + 1) {
          ppVar63->base[lVar47 + sVar65] = '\0';
        }
        if (ppVar37 != (ptls_key_schedule_t *)0x0) {
          ptls__key_schedule_update_hash(ppVar37,ppVar63->base + sVar61,ppVar63->off - sVar61);
        }
        ppVar63 = emitter->buf;
        ppVar63->off = sVar61;
        goto LAB_0011948b;
      }
    }
LAB_001194be:
    ptls_buffer_dispose(&session_id);
    psVar8 = tls->key_schedule->hashes[0].ctx;
    (*psVar8->final)(psVar8,(void *)0x0,PTLS_HASH_FINAL_MODE_FREE);
    tls->key_schedule->hashes[0].ctx = psVar34;
    if (iVar29 != 0) goto LAB_00119b7e;
    ppVar35 = tls->ctx;
  }
  iVar29 = 0x202;
  if ((ppVar35->field_0x68 & 8) == 0) {
    iVar29 = 0;
  }
LAB_00119b7e:
  free(pubkey.base);
  free(ecdh_secret.base);
  (*ptls_clear_memory)(finished_key,0x40);
  return iVar29;
}

Assistant:

static int server_handle_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message,
                               ptls_handshake_properties_t *properties)
{
#define EMIT_SERVER_HELLO(sched, fill_rand, extensions)                                                                            \
    ptls_push_message(emitter, (sched), PTLS_HANDSHAKE_TYPE_SERVER_HELLO, {                                                        \
        ptls_buffer_push16(emitter->buf, 0x0303 /* legacy version */);                                                             \
        if ((ret = ptls_buffer_reserve(emitter->buf, PTLS_HELLO_RANDOM_SIZE)) != 0)                                                \
            goto Exit;                                                                                                             \
        do {                                                                                                                       \
            fill_rand                                                                                                              \
        } while (0);                                                                                                               \
        emitter->buf->off += PTLS_HELLO_RANDOM_SIZE;                                                                               \
        ptls_buffer_push_block(emitter->buf, 1,                                                                                    \
                               { ptls_buffer_pushv(emitter->buf, ch.legacy_session_id.base, ch.legacy_session_id.len); });         \
        ptls_buffer_push16(emitter->buf, tls->cipher_suite->id);                                                                   \
        ptls_buffer_push(emitter->buf, 0);                                                                                         \
        ptls_buffer_push_block(emitter->buf, 2, {                                                                                  \
            buffer_push_extension(emitter->buf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS,                                            \
                                  { ptls_buffer_push16(emitter->buf, ch.selected_version); });                                     \
            do {                                                                                                                   \
                extensions                                                                                                         \
            } while (0);                                                                                                           \
        });                                                                                                                        \
    }